

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void av1_dr_prediction_z3_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  uint8_t uVar1;
  undefined8 uVar2;
  ushort uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  bool bVar46;
  long lVar47;
  uint8_t *puVar48;
  byte bVar49;
  long lVar50;
  undefined1 (*pauVar51) [16];
  long lVar52;
  ptrdiff_t pitchSrc;
  uint uVar53;
  int iVar54;
  int iVar55;
  ulong uVar56;
  uint uVar57;
  long lVar58;
  ulong uVar59;
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  ushort uVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  __m128i dstvec_2 [4];
  uint8_t dstT [4096];
  undefined8 auStack_1660 [11];
  undefined8 uStack_1608;
  undefined8 local_14e0 [16];
  undefined1 local_1460 [24];
  undefined8 uStack_1448;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [16];
  undefined1 auStack_1050 [16];
  undefined1 local_1040 [16];
  undefined1 auStack_1030 [16];
  undefined1 local_1020 [16];
  undefined1 auStack_1010 [16];
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  undefined1 local_fe0 [16];
  undefined1 auStack_fd0 [16];
  undefined1 local_fc0 [16];
  undefined1 auStack_fb0 [16];
  undefined1 local_fa0 [16];
  undefined1 auStack_f90 [16];
  undefined1 local_f80 [16];
  undefined1 auStack_f70 [16];
  undefined1 local_f60 [16];
  undefined1 auStack_f50 [16];
  undefined1 local_f40 [16];
  undefined1 auStack_f30 [16];
  undefined1 local_f20 [16];
  undefined1 auStack_f10 [16];
  undefined1 local_f00 [16];
  undefined1 auStack_ef0 [16];
  undefined1 local_ee0 [16];
  undefined1 auStack_ed0 [16];
  undefined1 local_ec0 [16];
  undefined1 auStack_eb0 [16];
  undefined1 local_ea0 [16];
  undefined1 auStack_e90 [16];
  undefined1 local_e80 [16];
  undefined1 auStack_e70 [16];
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined1 local_de0 [32];
  undefined1 local_dc0 [32];
  undefined1 local_da0 [32];
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  
  iVar55 = (int)left;
  bVar49 = (byte)upsample_left;
  if (bw == bh) {
    if (bw < 0x10) {
      if (bw == 4) {
        iVar55 = 7 << (bVar49 & 0x1f);
        uVar1 = left[iVar55];
        auVar66[1] = uVar1;
        auVar66[0] = uVar1;
        auVar66[2] = uVar1;
        auVar66[3] = uVar1;
        auVar66[4] = uVar1;
        auVar66[5] = uVar1;
        auVar66[6] = uVar1;
        auVar66[7] = uVar1;
        auVar66[8] = uVar1;
        auVar66[9] = uVar1;
        auVar66[10] = uVar1;
        auVar66[0xb] = uVar1;
        auVar66[0xc] = uVar1;
        auVar66[0xd] = uVar1;
        auVar66[0xe] = uVar1;
        auVar66[0xf] = uVar1;
        lVar47 = 0;
        auVar96._8_2_ = 0x10;
        auVar96._0_8_ = 0x10001000100010;
        auVar96._10_2_ = 0x10;
        auVar96._12_2_ = 0x10;
        auVar96._14_2_ = 0x10;
        auVar96._16_2_ = 0x10;
        auVar96._18_2_ = 0x10;
        auVar96._20_2_ = 0x10;
        auVar96._22_2_ = 0x10;
        auVar96._24_2_ = 0x10;
        auVar96._26_2_ = 0x10;
        auVar96._28_2_ = 0x10;
        auVar96._30_2_ = 0x10;
        auVar104._8_2_ = 0x1f;
        auVar104._0_8_ = 0x1f001f001f001f;
        auVar104._10_2_ = 0x1f;
        auVar104._12_2_ = 0x1f;
        auVar104._14_2_ = 0x1f;
        auVar104._16_2_ = 0x1f;
        auVar104._18_2_ = 0x1f;
        auVar104._20_2_ = 0x1f;
        auVar104._22_2_ = 0x1f;
        auVar104._24_2_ = 0x1f;
        auVar104._26_2_ = 0x1f;
        auVar104._28_2_ = 0x1f;
        auVar104._30_2_ = 0x1f;
        uVar59 = 0;
        uVar53 = dy;
        do {
          iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
          uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
          if ((int)uVar57 < 1) {
            if (uVar59 < 4) {
              do {
                *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
                lVar47 = lVar47 + 0x10;
              } while (lVar47 != 0x40);
            }
            break;
          }
          if (3 < uVar57) {
            uVar57 = 4;
          }
          auVar113 = *(undefined1 (*) [16])(left + iVar54);
          if (upsample_left == 0) {
            auVar112 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
            uVar3 = (ushort)(uVar53 >> 1);
            uVar92 = uVar3 & 0x1f;
            auVar126._0_8_ =
                 CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
            auVar126._8_2_ = uVar92;
            auVar126._10_2_ = uVar92;
            auVar126._12_2_ = uVar92;
            auVar126._14_2_ = uVar92;
            auVar126._16_2_ = uVar92;
            auVar126._18_2_ = uVar92;
            auVar126._20_2_ = uVar92;
            auVar126._22_2_ = uVar92;
            auVar126._24_2_ = uVar92;
            auVar126._26_2_ = uVar92;
            auVar126._28_2_ = uVar92;
            auVar126._30_2_ = uVar92;
          }
          else {
            auVar113 = vpshufb_avx(auVar113,_DAT_0050dc80);
            auVar112 = vpsrldq_avx(auVar113,8);
            auVar125._0_2_ = (undefined2)uVar53;
            auVar125._2_2_ = auVar125._0_2_;
            auVar125._4_2_ = auVar125._0_2_;
            auVar125._6_2_ = auVar125._0_2_;
            auVar125._8_2_ = auVar125._0_2_;
            auVar125._10_2_ = auVar125._0_2_;
            auVar125._12_2_ = auVar125._0_2_;
            auVar125._14_2_ = auVar125._0_2_;
            auVar125._16_2_ = auVar125._0_2_;
            auVar125._18_2_ = auVar125._0_2_;
            auVar125._20_2_ = auVar125._0_2_;
            auVar125._22_2_ = auVar125._0_2_;
            auVar125._24_2_ = auVar125._0_2_;
            auVar125._26_2_ = auVar125._0_2_;
            auVar125._28_2_ = auVar125._0_2_;
            auVar125._30_2_ = auVar125._0_2_;
            auVar126 = vpsllw_avx2(auVar125,ZEXT416((uint)upsample_left));
            auVar126 = vpsrlw_avx2(auVar126,1);
            auVar126 = vpand_avx2(auVar126,auVar104);
          }
          auVar125 = vpmovzxbw_avx2(auVar113);
          auVar80 = vpmovzxbw_avx2(auVar112);
          auVar80 = vpsubw_avx2(auVar80,auVar125);
          auVar80 = vpmullw_avx2(auVar80,auVar126);
          auVar126 = vpsllw_avx2(auVar125,5);
          auVar126 = vpaddw_avx2(auVar126,auVar96);
          auVar126 = vpaddw_avx2(auVar80,auVar126);
          auVar126 = vpsrlw_avx2(auVar126,5);
          auVar113 = vpackuswb_avx(auVar126._0_16_,auVar126._16_16_);
          auVar113 = vpblendvb_avx(auVar66,auVar113,*(undefined1 (*) [16])BaseMask[uVar57]);
          *(undefined1 (*) [16])(local_1060 + lVar47) = auVar113;
          uVar53 = uVar53 + dy;
          uVar59 = uVar59 + 1;
          lVar47 = lVar47 + 0x10;
        } while (uVar59 != 4);
        auVar66 = vpunpcklbw_avx(local_1060,auStack_1050);
        auVar113 = vpunpcklbw_avx(local_1040,auStack_1030);
        auVar66 = vpunpcklwd_avx(auVar66,auVar113);
        *(int *)dst = auVar66._0_4_;
        *(int *)(dst + stride) = auVar66._4_4_;
        *(int *)(dst + stride * 2) = auVar66._8_4_;
        *(int *)(dst + stride * 3) = auVar66._12_4_;
        return;
      }
      if (bw != 8) {
        return;
      }
      iVar55 = 0xf << (bVar49 & 0x1f);
      uVar1 = left[iVar55];
      auVar113[1] = uVar1;
      auVar113[0] = uVar1;
      auVar113[2] = uVar1;
      auVar113[3] = uVar1;
      auVar113[4] = uVar1;
      auVar113[5] = uVar1;
      auVar113[6] = uVar1;
      auVar113[7] = uVar1;
      auVar113[8] = uVar1;
      auVar113[9] = uVar1;
      auVar113[10] = uVar1;
      auVar113[0xb] = uVar1;
      auVar113[0xc] = uVar1;
      auVar113[0xd] = uVar1;
      auVar113[0xe] = uVar1;
      auVar113[0xf] = uVar1;
      lVar47 = 0;
      auVar80._8_2_ = 0x10;
      auVar80._0_8_ = 0x10001000100010;
      auVar80._10_2_ = 0x10;
      auVar80._12_2_ = 0x10;
      auVar80._14_2_ = 0x10;
      auVar80._16_2_ = 0x10;
      auVar80._18_2_ = 0x10;
      auVar80._20_2_ = 0x10;
      auVar80._22_2_ = 0x10;
      auVar80._24_2_ = 0x10;
      auVar80._26_2_ = 0x10;
      auVar80._28_2_ = 0x10;
      auVar80._30_2_ = 0x10;
      auVar99._8_2_ = 0x1f;
      auVar99._0_8_ = 0x1f001f001f001f;
      auVar99._10_2_ = 0x1f;
      auVar99._12_2_ = 0x1f;
      auVar99._14_2_ = 0x1f;
      auVar99._16_2_ = 0x1f;
      auVar99._18_2_ = 0x1f;
      auVar99._20_2_ = 0x1f;
      auVar99._22_2_ = 0x1f;
      auVar99._24_2_ = 0x1f;
      auVar99._26_2_ = 0x1f;
      auVar99._28_2_ = 0x1f;
      auVar99._30_2_ = 0x1f;
      uVar59 = 0;
      uVar53 = dy;
      do {
        iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
        uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
        if ((int)uVar57 < 1) {
          if (uVar59 < 8) {
            do {
              *(undefined1 (*) [16])(local_1060 + lVar47) = auVar113;
              lVar47 = lVar47 + 0x10;
            } while (lVar47 != 0x80);
          }
          break;
        }
        if (7 < uVar57) {
          uVar57 = 8;
        }
        auVar66 = *(undefined1 (*) [16])(left + iVar54);
        if (upsample_left == 0) {
          auVar112 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
          uVar3 = (ushort)(uVar53 >> 1);
          uVar92 = uVar3 & 0x1f;
          auVar118._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
          auVar118._8_2_ = uVar92;
          auVar118._10_2_ = uVar92;
          auVar118._12_2_ = uVar92;
          auVar118._14_2_ = uVar92;
          auVar118._16_2_ = uVar92;
          auVar118._18_2_ = uVar92;
          auVar118._20_2_ = uVar92;
          auVar118._22_2_ = uVar92;
          auVar118._24_2_ = uVar92;
          auVar118._26_2_ = uVar92;
          auVar118._28_2_ = uVar92;
          auVar118._30_2_ = uVar92;
        }
        else {
          auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
          auVar112 = vpsrldq_avx(auVar66,8);
          auVar76._0_2_ = (undefined2)uVar53;
          auVar76._2_2_ = auVar76._0_2_;
          auVar76._4_2_ = auVar76._0_2_;
          auVar76._6_2_ = auVar76._0_2_;
          auVar76._8_2_ = auVar76._0_2_;
          auVar76._10_2_ = auVar76._0_2_;
          auVar76._12_2_ = auVar76._0_2_;
          auVar76._14_2_ = auVar76._0_2_;
          auVar76._16_2_ = auVar76._0_2_;
          auVar76._18_2_ = auVar76._0_2_;
          auVar76._20_2_ = auVar76._0_2_;
          auVar76._22_2_ = auVar76._0_2_;
          auVar76._24_2_ = auVar76._0_2_;
          auVar76._26_2_ = auVar76._0_2_;
          auVar76._28_2_ = auVar76._0_2_;
          auVar76._30_2_ = auVar76._0_2_;
          auVar96 = vpsllw_avx2(auVar76,ZEXT416((uint)upsample_left));
          auVar96 = vpsrlw_avx2(auVar96,1);
          auVar118 = vpand_avx2(auVar96,auVar99);
        }
        auVar96 = vpmovzxbw_avx2(auVar66);
        auVar104 = vpmovzxbw_avx2(auVar112);
        auVar104 = vpsubw_avx2(auVar104,auVar96);
        auVar104 = vpmullw_avx2(auVar104,auVar118);
        auVar96 = vpsllw_avx2(auVar96,5);
        auVar96 = vpaddw_avx2(auVar96,auVar80);
        auVar96 = vpaddw_avx2(auVar104,auVar96);
        auVar96 = vpsrlw_avx2(auVar96,5);
        auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
        auVar66 = vpblendvb_avx(auVar113,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
        *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
        uVar53 = uVar53 + dy;
        uVar59 = uVar59 + 1;
        lVar47 = lVar47 + 0x10;
      } while (uVar59 != 8);
      auVar66 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar112 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar65 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar70 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar113 = vpunpcklwd_avx(auVar66,auVar112);
      auVar72 = vpunpcklwd_avx(auVar65,auVar70);
      auVar61 = vpunpckldq_avx(auVar113,auVar72);
      *(long *)dst = auVar61._0_8_;
      uVar2 = vpextrq_avx(auVar61,1);
      *(undefined8 *)(dst + stride) = uVar2;
      auVar113 = vpunpckhdq_avx(auVar113,auVar72);
      auVar66 = vpunpckhwd_avx(auVar66,auVar112);
      *(long *)(dst + stride * 2) = auVar113._0_8_;
      uVar2 = vpextrq_avx(auVar113,1);
      *(undefined8 *)(dst + stride * 3) = uVar2;
      auVar113 = vpunpckhwd_avx(auVar65,auVar70);
      auVar112 = vpunpckldq_avx(auVar66,auVar113);
      *(long *)(dst + stride * 4) = auVar112._0_8_;
      uVar2 = vpextrq_avx(auVar112,1);
      *(undefined8 *)(dst + stride * 5) = uVar2;
      auVar66 = vpunpckhdq_avx(auVar66,auVar113);
      *(long *)(dst + stride * 6) = auVar66._0_8_;
      lVar47 = stride * 7;
LAB_0035bc44:
      uVar2 = vpextrq_avx(auVar66,1);
      *(undefined8 *)(dst + lVar47) = uVar2;
      return;
    }
    if (bw == 0x10) {
      iVar55 = 0x1f << (bVar49 & 0x1f);
      uVar1 = left[iVar55];
      auVar112[1] = uVar1;
      auVar112[0] = uVar1;
      auVar112[2] = uVar1;
      auVar112[3] = uVar1;
      auVar112[4] = uVar1;
      auVar112[5] = uVar1;
      auVar112[6] = uVar1;
      auVar112[7] = uVar1;
      auVar112[8] = uVar1;
      auVar112[9] = uVar1;
      auVar112[10] = uVar1;
      auVar112[0xb] = uVar1;
      auVar112[0xc] = uVar1;
      auVar112[0xd] = uVar1;
      auVar112[0xe] = uVar1;
      auVar112[0xf] = uVar1;
      lVar47 = 0;
      auVar83._8_2_ = 0x10;
      auVar83._0_8_ = 0x10001000100010;
      auVar83._10_2_ = 0x10;
      auVar83._12_2_ = 0x10;
      auVar83._14_2_ = 0x10;
      auVar83._16_2_ = 0x10;
      auVar83._18_2_ = 0x10;
      auVar83._20_2_ = 0x10;
      auVar83._22_2_ = 0x10;
      auVar83._24_2_ = 0x10;
      auVar83._26_2_ = 0x10;
      auVar83._28_2_ = 0x10;
      auVar83._30_2_ = 0x10;
      auVar102._8_2_ = 0x1f;
      auVar102._0_8_ = 0x1f001f001f001f;
      auVar102._10_2_ = 0x1f;
      auVar102._12_2_ = 0x1f;
      auVar102._14_2_ = 0x1f;
      auVar102._16_2_ = 0x1f;
      auVar102._18_2_ = 0x1f;
      auVar102._20_2_ = 0x1f;
      auVar102._22_2_ = 0x1f;
      auVar102._24_2_ = 0x1f;
      auVar102._26_2_ = 0x1f;
      auVar102._28_2_ = 0x1f;
      auVar102._30_2_ = 0x1f;
      uVar59 = 0;
      uVar53 = dy;
      do {
        iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
        uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
        if ((int)uVar57 < 1) {
          if (uVar59 < 0x10) {
            do {
              *(undefined1 (*) [16])(local_1060 + lVar47) = auVar112;
              lVar47 = lVar47 + 0x10;
            } while (lVar47 != 0x100);
          }
          break;
        }
        if (0xf < uVar57) {
          uVar57 = 0x10;
        }
        auVar66 = *(undefined1 (*) [16])(left + iVar54);
        if (upsample_left == 0) {
          auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
          uVar3 = (ushort)(uVar53 >> 1);
          uVar92 = uVar3 & 0x1f;
          auVar124._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
          auVar124._8_2_ = uVar92;
          auVar124._10_2_ = uVar92;
          auVar124._12_2_ = uVar92;
          auVar124._14_2_ = uVar92;
          auVar124._16_2_ = uVar92;
          auVar124._18_2_ = uVar92;
          auVar124._20_2_ = uVar92;
          auVar124._22_2_ = uVar92;
          auVar124._24_2_ = uVar92;
          auVar124._26_2_ = uVar92;
          auVar124._28_2_ = uVar92;
          auVar124._30_2_ = uVar92;
        }
        else {
          auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
          auVar113 = vpsrldq_avx(auVar66,8);
          auVar123._0_2_ = (undefined2)uVar53;
          auVar123._2_2_ = auVar123._0_2_;
          auVar123._4_2_ = auVar123._0_2_;
          auVar123._6_2_ = auVar123._0_2_;
          auVar123._8_2_ = auVar123._0_2_;
          auVar123._10_2_ = auVar123._0_2_;
          auVar123._12_2_ = auVar123._0_2_;
          auVar123._14_2_ = auVar123._0_2_;
          auVar123._16_2_ = auVar123._0_2_;
          auVar123._18_2_ = auVar123._0_2_;
          auVar123._20_2_ = auVar123._0_2_;
          auVar123._22_2_ = auVar123._0_2_;
          auVar123._24_2_ = auVar123._0_2_;
          auVar123._26_2_ = auVar123._0_2_;
          auVar123._28_2_ = auVar123._0_2_;
          auVar123._30_2_ = auVar123._0_2_;
          auVar96 = vpsllw_avx2(auVar123,ZEXT416((uint)upsample_left));
          auVar96 = vpsrlw_avx2(auVar96,1);
          auVar124 = vpand_avx2(auVar96,auVar102);
        }
        auVar96 = vpmovzxbw_avx2(auVar66);
        auVar104 = vpmovzxbw_avx2(auVar113);
        auVar104 = vpsubw_avx2(auVar104,auVar96);
        auVar104 = vpmullw_avx2(auVar104,auVar124);
        auVar96 = vpsllw_avx2(auVar96,5);
        auVar96 = vpaddw_avx2(auVar96,auVar83);
        auVar96 = vpaddw_avx2(auVar104,auVar96);
        auVar96 = vpsrlw_avx2(auVar96,5);
        auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
        auVar66 = vpblendvb_avx(auVar112,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
        *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
        uVar53 = uVar53 + dy;
        uVar59 = uVar59 + 1;
        lVar47 = lVar47 + 0x10;
      } while (uVar59 != 0x10);
      auVar112 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar65 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar70 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar72 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar66 = vpunpcklwd_avx(auVar112,auVar65);
      auVar113 = vpunpcklwd_avx(auVar70,auVar72);
      auVar64 = vpunpckldq_avx(auVar66,auVar113);
      auVar66 = vpunpckhdq_avx(auVar66,auVar113);
      auVar61 = vpunpcklbw_avx(local_fe0,auStack_fd0);
      auVar67 = vpunpcklbw_avx(local_fc0,auStack_fb0);
      auVar63 = vpunpcklbw_avx(local_fa0,auStack_f90);
      auVar69 = vpunpcklbw_avx(local_f80,auStack_f70);
      auVar113 = vpunpcklwd_avx(auVar61,auVar67);
      auVar68 = vpunpcklwd_avx(auVar63,auVar69);
      auVar71 = vpunpckldq_avx(auVar113,auVar68);
      auVar113 = vpunpckhdq_avx(auVar113,auVar68);
      local_1460._0_16_ = vpunpcklqdq_avx(auVar64,auVar71);
      unique0x00102d80 = vpunpckhqdq_avx(auVar64,auVar71);
      local_1440._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
      local_1440._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
      auVar66 = vpunpckhwd_avx(auVar112,auVar65);
      auVar113 = vpunpckhwd_avx(auVar70,auVar72);
      auVar112 = vpunpckhwd_avx(auVar61,auVar67);
      auVar65 = vpunpckhwd_avx(auVar63,auVar69);
      auVar70 = vpunpckldq_avx(auVar66,auVar113);
      auVar66 = vpunpckhdq_avx(auVar66,auVar113);
      auVar72 = vpunpckldq_avx(auVar112,auVar65);
      auVar113 = vpunpckhdq_avx(auVar112,auVar65);
      local_1420._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
      local_1420._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
      local_1400._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
      local_1400._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
      auVar66 = vpunpckhbw_avx(local_1060,auStack_1050);
      auVar113 = vpunpckhbw_avx(local_1040,auStack_1030);
      auVar112 = vpunpckhbw_avx(local_1020,auStack_1010);
      auVar65 = vpunpckhbw_avx(local_1000,auStack_ff0);
      auVar70 = vpunpckhbw_avx(local_fe0,auStack_fd0);
      auVar72 = vpunpckhbw_avx(local_fc0,auStack_fb0);
      auVar61 = vpunpckhbw_avx(local_fa0,auStack_f90);
      auVar67 = vpunpckhbw_avx(local_f80,auStack_f70);
      auVar63 = vpunpcklwd_avx(auVar66,auVar113);
      auVar69 = vpunpcklwd_avx(auVar112,auVar65);
      auVar68 = vpunpcklwd_avx(auVar70,auVar72);
      auVar64 = vpunpcklwd_avx(auVar61,auVar67);
      auVar71 = vpunpckldq_avx(auVar63,auVar69);
      auVar63 = vpunpckhdq_avx(auVar63,auVar69);
      auVar73 = vpunpckldq_avx(auVar68,auVar64);
      auVar69 = vpunpckhdq_avx(auVar68,auVar64);
      local_13e0._0_16_ = vpunpcklqdq_avx(auVar71,auVar73);
      local_13e0._16_16_ = vpunpckhqdq_avx(auVar71,auVar73);
      local_13c0._0_16_ = vpunpcklqdq_avx(auVar63,auVar69);
      local_13c0._16_16_ = vpunpckhqdq_avx(auVar63,auVar69);
      auVar66 = vpunpckhwd_avx(auVar66,auVar113);
      auVar113 = vpunpckhwd_avx(auVar112,auVar65);
      auVar112 = vpunpckhwd_avx(auVar70,auVar72);
      auVar65 = vpunpckhwd_avx(auVar61,auVar67);
      auVar70 = vpunpckldq_avx(auVar66,auVar113);
      auVar66 = vpunpckhdq_avx(auVar66,auVar113);
      auVar72 = vpunpckldq_avx(auVar112,auVar65);
      auVar113 = vpunpckhdq_avx(auVar112,auVar65);
      local_13a0._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
      local_13a0._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
      local_1380._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
      local_1380._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
      lVar47 = 0;
      do {
        uVar2 = *(undefined8 *)(local_1460 + lVar47 + 8);
        *(undefined8 *)dst = *(undefined8 *)(local_1460 + lVar47);
        *(undefined8 *)(dst + 8) = uVar2;
        lVar47 = lVar47 + 0x10;
        dst = dst + stride;
      } while (lVar47 != 0x100);
      return;
    }
    if (bw == 0x20) {
      uVar1 = left[0x3f];
      auVar65[1] = uVar1;
      auVar65[0] = uVar1;
      auVar65[2] = uVar1;
      auVar65[3] = uVar1;
      auVar65[4] = uVar1;
      auVar65[5] = uVar1;
      auVar65[6] = uVar1;
      auVar65[7] = uVar1;
      auVar65[8] = uVar1;
      auVar65[9] = uVar1;
      auVar65[10] = uVar1;
      auVar65[0xb] = uVar1;
      auVar65[0xc] = uVar1;
      auVar65[0xd] = uVar1;
      auVar65[0xe] = uVar1;
      auVar65[0xf] = uVar1;
      auVar74[0x10] = uVar1;
      auVar74._0_16_ = auVar65;
      auVar74[0x11] = uVar1;
      auVar74[0x12] = uVar1;
      auVar74[0x13] = uVar1;
      auVar74[0x14] = uVar1;
      auVar74[0x15] = uVar1;
      auVar74[0x16] = uVar1;
      auVar74[0x17] = uVar1;
      auVar74[0x18] = uVar1;
      auVar74[0x19] = uVar1;
      auVar74[0x1a] = uVar1;
      auVar74[0x1b] = uVar1;
      auVar74[0x1c] = uVar1;
      auVar74[0x1d] = uVar1;
      auVar74[0x1e] = uVar1;
      auVar74[0x1f] = uVar1;
      lVar47 = 0;
      auVar84._8_2_ = 0x10;
      auVar84._0_8_ = 0x10001000100010;
      auVar84._10_2_ = 0x10;
      auVar84._12_2_ = 0x10;
      auVar84._14_2_ = 0x10;
      auVar84._16_2_ = 0x10;
      auVar84._18_2_ = 0x10;
      auVar84._20_2_ = 0x10;
      auVar84._22_2_ = 0x10;
      auVar84._24_2_ = 0x10;
      auVar84._26_2_ = 0x10;
      auVar84._28_2_ = 0x10;
      auVar84._30_2_ = 0x10;
      lVar52 = 0;
      uVar53 = dy;
      do {
        iVar55 = (int)uVar53 >> 6;
        lVar50 = lVar47;
        if (iVar55 < 0x3f) {
          uVar57 = -(iVar55 + -0x3f);
          uVar3 = (ushort)(uVar53 >> 1);
          uVar92 = uVar3 & 0x1f;
          auVar93._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
          auVar93._8_2_ = uVar92;
          auVar93._10_2_ = uVar92;
          auVar93._12_2_ = uVar92;
          auVar93._14_2_ = uVar92;
          auVar93._16_2_ = uVar92;
          auVar93._18_2_ = uVar92;
          auVar93._20_2_ = uVar92;
          auVar93._22_2_ = uVar92;
          auVar93._24_2_ = uVar92;
          auVar93._26_2_ = uVar92;
          auVar93._28_2_ = uVar92;
          auVar93._30_2_ = uVar92;
          lVar58 = 0;
          lVar50 = 0;
          do {
            auVar96 = auVar74;
            if (lVar50 < (int)uVar57) {
              auVar96 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar50 + iVar55));
              auVar104 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar50 + (long)iVar55 + 1));
              auVar104 = vpsubw_avx2(auVar104,auVar96);
              auVar104 = vpmullw_avx2(auVar104,auVar93);
              auVar96 = vpsllw_avx2(auVar96,5);
              auVar96 = vpaddw_avx2(auVar96,auVar84);
              auVar96 = vpaddw_avx2(auVar104,auVar96);
              auVar96 = vpsrlw_avx2(auVar96,5);
              auVar103._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar96._16_16_;
              auVar103._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar65;
              auVar96 = vpackuswb_avx2(auVar96,auVar103);
            }
            *(undefined1 (*) [32])(local_1460 + lVar58) = auVar96;
            lVar58 = lVar58 + 0x20;
            lVar50 = 0x10;
          } while (lVar58 != 0x40);
          if (0x1f < uVar57) {
            uVar57 = 0x20;
          }
          auVar96 = vperm2i128_avx2(_local_1460,local_1440,0x20);
          auVar96 = vpblendvb_avx2(auVar74,auVar96,
                                   *(undefined1 (*) [32])(BaseMask[0] + (uVar57 << 5)));
          *(undefined1 (*) [32])(local_1060 + lVar52 * 0x20) = auVar96;
          uVar53 = uVar53 + dy;
        }
        else {
          do {
            *(undefined1 (*) [32])(local_1060 + lVar50) = auVar74;
            lVar50 = lVar50 + 0x20;
          } while (lVar50 != 0x400);
        }
        if (0x3e < iVar55) break;
        lVar52 = lVar52 + 1;
        lVar47 = lVar47 + 0x20;
      } while (lVar52 != 0x20);
      auVar6._16_16_ = auStack_1050;
      auVar6._0_16_ = local_1060;
      auVar9._16_16_ = auStack_1030;
      auVar9._0_16_ = local_1040;
      auVar12._16_16_ = auStack_1010;
      auVar12._0_16_ = local_1020;
      auVar15._16_16_ = auStack_ff0;
      auVar15._0_16_ = local_1000;
      auVar126 = vpunpcklbw_avx2(auVar6,auVar9);
      auVar125 = vpunpcklbw_avx2(auVar12,auVar15);
      auVar18._16_16_ = auStack_fd0;
      auVar18._0_16_ = local_fe0;
      auVar21._16_16_ = auStack_fb0;
      auVar21._0_16_ = local_fc0;
      auVar80 = vpunpcklbw_avx2(auVar18,auVar21);
      auVar24._16_16_ = auStack_f90;
      auVar24._0_16_ = local_fa0;
      auVar27._16_16_ = auStack_f70;
      auVar27._0_16_ = local_f80;
      auVar99 = vpunpcklbw_avx2(auVar24,auVar27);
      auVar30._16_16_ = auStack_f50;
      auVar30._0_16_ = local_f60;
      auVar96 = vpunpcklwd_avx2(auVar126,auVar125);
      auVar104 = vpunpcklwd_avx2(auVar80,auVar99);
      auVar123 = vpunpckldq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
      auVar32._16_16_ = auStack_f30;
      auVar32._0_16_ = local_f40;
      auVar118 = vpunpcklbw_avx2(auVar30,auVar32);
      auVar34._16_16_ = auStack_f10;
      auVar34._0_16_ = local_f20;
      auVar36._16_16_ = auStack_ef0;
      auVar36._0_16_ = local_f00;
      auVar76 = vpunpcklbw_avx2(auVar34,auVar36);
      auVar38._16_16_ = auStack_ed0;
      auVar38._0_16_ = local_ee0;
      auVar40._16_16_ = auStack_eb0;
      auVar40._0_16_ = local_ec0;
      auVar83 = vpunpcklbw_avx2(auVar38,auVar40);
      auVar42._16_16_ = auStack_e90;
      auVar42._0_16_ = local_ea0;
      auVar44._16_16_ = auStack_e70;
      auVar44._0_16_ = local_e80;
      auVar102 = vpunpcklbw_avx2(auVar42,auVar44);
      auVar104 = vpunpcklwd_avx2(auVar118,auVar76);
      auVar124 = vpunpcklwd_avx2(auVar83,auVar102);
      auVar74 = vpunpckldq_avx2(auVar104,auVar124);
      auVar104 = vpunpckhdq_avx2(auVar104,auVar124);
      _local_1460 = vpunpcklqdq_avx2(auVar123,auVar74);
      local_1440 = vpunpckhqdq_avx2(auVar123,auVar74);
      local_1420 = vpunpcklqdq_avx2(auVar96,auVar104);
      local_1400 = vpunpckhqdq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhwd_avx2(auVar126,auVar125);
      auVar104 = vpunpckhwd_avx2(auVar80,auVar99);
      auVar126 = vpunpckhwd_avx2(auVar118,auVar76);
      auVar125 = vpunpckhwd_avx2(auVar83,auVar102);
      auVar80 = vpunpckldq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
      auVar99 = vpunpckldq_avx2(auVar126,auVar125);
      auVar104 = vpunpckhdq_avx2(auVar126,auVar125);
      local_13e0 = vpunpcklqdq_avx2(auVar80,auVar99);
      local_13c0 = vpunpckhqdq_avx2(auVar80,auVar99);
      local_13a0 = vpunpcklqdq_avx2(auVar96,auVar104);
      local_1380 = vpunpckhqdq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhbw_avx2(auVar6,auVar9);
      auVar104 = vpunpckhbw_avx2(auVar12,auVar15);
      auVar126 = vpunpckhbw_avx2(auVar18,auVar21);
      auVar125 = vpunpckhbw_avx2(auVar24,auVar27);
      auVar80 = vpunpckhbw_avx2(auVar30,auVar32);
      auVar99 = vpunpckhbw_avx2(auVar34,auVar36);
      auVar118 = vpunpckhbw_avx2(auVar38,auVar40);
      auVar76 = vpunpckhbw_avx2(auVar42,auVar44);
      auVar83 = vpunpcklwd_avx2(auVar96,auVar104);
      auVar102 = vpunpcklwd_avx2(auVar126,auVar125);
      auVar124 = vpunpcklwd_avx2(auVar80,auVar99);
      auVar123 = vpunpcklwd_avx2(auVar118,auVar76);
      auVar74 = vpunpckldq_avx2(auVar83,auVar102);
      auVar83 = vpunpckhdq_avx2(auVar83,auVar102);
      auVar84 = vpunpckldq_avx2(auVar124,auVar123);
      auVar102 = vpunpckhdq_avx2(auVar124,auVar123);
      local_1360 = vpunpcklqdq_avx2(auVar74,auVar84);
      local_1340 = vpunpckhqdq_avx2(auVar74,auVar84);
      local_1320 = vpunpcklqdq_avx2(auVar83,auVar102);
      local_1300 = vpunpckhqdq_avx2(auVar83,auVar102);
      auVar96 = vpunpckhwd_avx2(auVar96,auVar104);
      auVar104 = vpunpckhwd_avx2(auVar126,auVar125);
      auVar126 = vpunpckhwd_avx2(auVar80,auVar99);
      auVar125 = vpunpckhwd_avx2(auVar118,auVar76);
      auVar80 = vpunpckldq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
      auVar99 = vpunpckldq_avx2(auVar126,auVar125);
      auVar104 = vpunpckhdq_avx2(auVar126,auVar125);
      local_12e0 = vpunpcklqdq_avx2(auVar80,auVar99);
      local_12c0 = vpunpckhqdq_avx2(auVar80,auVar99);
      local_12a0 = vpunpcklqdq_avx2(auVar96,auVar104);
      local_1280 = vpunpckhqdq_avx2(auVar96,auVar104);
      auVar126 = vpunpcklbw_avx2(local_e60,local_e40);
      auVar125 = vpunpcklbw_avx2(local_e20,local_e00);
      auVar80 = vpunpcklbw_avx2(local_de0,local_dc0);
      auVar99 = vpunpcklbw_avx2(local_da0,local_d80);
      auVar96 = vpunpcklwd_avx2(auVar126,auVar125);
      auVar104 = vpunpcklwd_avx2(auVar80,auVar99);
      auVar123 = vpunpckldq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
      auVar118 = vpunpcklbw_avx2(local_d60,local_d40);
      auVar76 = vpunpcklbw_avx2(local_d20,local_d00);
      auVar83 = vpunpcklbw_avx2(local_ce0,local_cc0);
      auVar102 = vpunpcklbw_avx2(local_ca0,local_c80);
      auVar104 = vpunpcklwd_avx2(auVar118,auVar76);
      auVar124 = vpunpcklwd_avx2(auVar83,auVar102);
      auVar74 = vpunpckldq_avx2(auVar104,auVar124);
      auVar104 = vpunpckhdq_avx2(auVar104,auVar124);
      local_1260 = vpunpcklqdq_avx2(auVar123,auVar74);
      local_1240 = vpunpckhqdq_avx2(auVar123,auVar74);
      local_1220 = vpunpcklqdq_avx2(auVar96,auVar104);
      local_1200 = vpunpckhqdq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhwd_avx2(auVar126,auVar125);
      auVar104 = vpunpckhwd_avx2(auVar80,auVar99);
      auVar126 = vpunpckhwd_avx2(auVar118,auVar76);
      auVar125 = vpunpckhwd_avx2(auVar83,auVar102);
      auVar80 = vpunpckldq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
      auVar99 = vpunpckldq_avx2(auVar126,auVar125);
      auVar104 = vpunpckhdq_avx2(auVar126,auVar125);
      local_11e0 = vpunpcklqdq_avx2(auVar80,auVar99);
      local_11c0 = vpunpckhqdq_avx2(auVar80,auVar99);
      local_11a0 = vpunpcklqdq_avx2(auVar96,auVar104);
      local_1180 = vpunpckhqdq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhbw_avx2(local_e60,local_e40);
      auVar104 = vpunpckhbw_avx2(local_e20,local_e00);
      auVar126 = vpunpckhbw_avx2(local_de0,local_dc0);
      auVar125 = vpunpckhbw_avx2(local_da0,local_d80);
      auVar80 = vpunpckhbw_avx2(local_d60,local_d40);
      auVar99 = vpunpckhbw_avx2(local_d20,local_d00);
      auVar118 = vpunpckhbw_avx2(local_ce0,local_cc0);
      auVar76 = vpunpckhbw_avx2(local_ca0,local_c80);
      auVar83 = vpunpcklwd_avx2(auVar96,auVar104);
      auVar102 = vpunpcklwd_avx2(auVar126,auVar125);
      auVar124 = vpunpcklwd_avx2(auVar80,auVar99);
      auVar123 = vpunpcklwd_avx2(auVar118,auVar76);
      auVar74 = vpunpckldq_avx2(auVar83,auVar102);
      auVar83 = vpunpckhdq_avx2(auVar83,auVar102);
      auVar84 = vpunpckldq_avx2(auVar124,auVar123);
      auVar102 = vpunpckhdq_avx2(auVar124,auVar123);
      local_1160 = vpunpcklqdq_avx2(auVar74,auVar84);
      local_1140 = vpunpckhqdq_avx2(auVar74,auVar84);
      local_1120 = vpunpcklqdq_avx2(auVar83,auVar102);
      local_1100 = vpunpckhqdq_avx2(auVar83,auVar102);
      auVar96 = vpunpckhwd_avx2(auVar96,auVar104);
      auVar104 = vpunpckhwd_avx2(auVar126,auVar125);
      auVar126 = vpunpckhwd_avx2(auVar80,auVar99);
      auVar125 = vpunpckhwd_avx2(auVar118,auVar76);
      auVar80 = vpunpckldq_avx2(auVar96,auVar104);
      auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
      auVar99 = vpunpckldq_avx2(auVar126,auVar125);
      auVar104 = vpunpckhdq_avx2(auVar126,auVar125);
      local_10e0 = vpunpcklqdq_avx2(auVar80,auVar99);
      local_10c0 = vpunpckhqdq_avx2(auVar80,auVar99);
      local_10a0 = vpunpcklqdq_avx2(auVar96,auVar104);
      local_1080 = vpunpckhqdq_avx2(auVar96,auVar104);
      puVar48 = dst + 0x10;
      lVar47 = 0x200;
      do {
        uVar2 = *(undefined8 *)((long)auStack_1660 + lVar47 + 8);
        *(undefined8 *)(puVar48 + -0x10) = *(undefined8 *)((long)auStack_1660 + lVar47);
        *(undefined8 *)(puVar48 + -8) = uVar2;
        uVar2 = *(undefined8 *)(local_1460 + lVar47 + 8);
        *(undefined8 *)puVar48 = *(undefined8 *)(local_1460 + lVar47);
        *(undefined8 *)(puVar48 + 8) = uVar2;
        lVar47 = lVar47 + 0x20;
        puVar48 = puVar48 + stride;
      } while (lVar47 != 0x400);
      puVar48 = dst + stride * 0x10 + 0x10;
      lVar47 = 0x200;
      do {
        uVar2 = *(undefined8 *)((long)auStack_1660 + lVar47 + 0x18);
        *(undefined8 *)puVar48 = *(undefined8 *)((long)auStack_1660 + lVar47 + 0x10);
        *(undefined8 *)(puVar48 + 8) = uVar2;
        uVar2 = *(undefined8 *)(local_1440 + lVar47 + -8);
        *(undefined8 *)(puVar48 + 0x10) = *(undefined8 *)(local_1460 + lVar47 + 0x10);
        *(undefined8 *)(puVar48 + 0x18) = uVar2;
        lVar47 = lVar47 + 0x20;
        puVar48 = puVar48 + stride;
      } while (lVar47 != 0x400);
      return;
    }
    if (bw != 0x40) {
      return;
    }
    uStack_1608 = 0x358cda;
    dr_prediction_z1_64xN_avx2(0x40,local_1060,0x40,left,dy,iVar55);
    iVar55 = 0x40;
LAB_0035ae71:
    pitchSrc = 0x40;
    iVar54 = 0x40;
LAB_0035ae77:
    uStack_1608 = 0x35ae7c;
    transpose(local_1060,pitchSrc,dst,stride,iVar55,iVar54);
  }
  else {
    if (bw < bh) {
      if (bw * 2 == bh) {
        switch(bw << 0x1e | bw - 4U >> 2) {
        case 0:
          iVar55 = 0xb << (bVar49 & 0x1f);
          uVar1 = left[iVar55];
          auVar61[1] = uVar1;
          auVar61[0] = uVar1;
          auVar61[2] = uVar1;
          auVar61[3] = uVar1;
          auVar61[4] = uVar1;
          auVar61[5] = uVar1;
          auVar61[6] = uVar1;
          auVar61[7] = uVar1;
          auVar61[8] = uVar1;
          auVar61[9] = uVar1;
          auVar61[10] = uVar1;
          auVar61[0xb] = uVar1;
          auVar61[0xc] = uVar1;
          auVar61[0xd] = uVar1;
          auVar61[0xe] = uVar1;
          auVar61[0xf] = uVar1;
          lVar47 = 0;
          auVar78._8_2_ = 0x10;
          auVar78._0_8_ = 0x10001000100010;
          auVar78._10_2_ = 0x10;
          auVar78._12_2_ = 0x10;
          auVar78._14_2_ = 0x10;
          auVar78._16_2_ = 0x10;
          auVar78._18_2_ = 0x10;
          auVar78._20_2_ = 0x10;
          auVar78._22_2_ = 0x10;
          auVar78._24_2_ = 0x10;
          auVar78._26_2_ = 0x10;
          auVar78._28_2_ = 0x10;
          auVar78._30_2_ = 0x10;
          auVar97._8_2_ = 0x1f;
          auVar97._0_8_ = 0x1f001f001f001f;
          auVar97._10_2_ = 0x1f;
          auVar97._12_2_ = 0x1f;
          auVar97._14_2_ = 0x1f;
          auVar97._16_2_ = 0x1f;
          auVar97._18_2_ = 0x1f;
          auVar97._20_2_ = 0x1f;
          auVar97._22_2_ = 0x1f;
          auVar97._24_2_ = 0x1f;
          auVar97._26_2_ = 0x1f;
          auVar97._28_2_ = 0x1f;
          auVar97._30_2_ = 0x1f;
          uVar59 = 0;
          uVar53 = dy;
          do {
            iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
            uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
            if ((int)uVar57 < 1) {
              if (uVar59 < 4) {
                do {
                  *(undefined1 (*) [16])(local_1460 + lVar47) = auVar61;
                  lVar47 = lVar47 + 0x10;
                } while (lVar47 != 0x40);
              }
              break;
            }
            if (7 < uVar57) {
              uVar57 = 8;
            }
            auVar66 = *(undefined1 (*) [16])(left + iVar54);
            if (upsample_left == 0) {
              auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
              uVar3 = (ushort)(uVar53 >> 1);
              uVar92 = uVar3 & 0x1f;
              auVar115._0_8_ =
                   CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
              auVar115._8_2_ = uVar92;
              auVar115._10_2_ = uVar92;
              auVar115._12_2_ = uVar92;
              auVar115._14_2_ = uVar92;
              auVar115._16_2_ = uVar92;
              auVar115._18_2_ = uVar92;
              auVar115._20_2_ = uVar92;
              auVar115._22_2_ = uVar92;
              auVar115._24_2_ = uVar92;
              auVar115._26_2_ = uVar92;
              auVar115._28_2_ = uVar92;
              auVar115._30_2_ = uVar92;
            }
            else {
              auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
              auVar113 = vpsrldq_avx(auVar66,8);
              auVar114._0_2_ = (undefined2)uVar53;
              auVar114._2_2_ = auVar114._0_2_;
              auVar114._4_2_ = auVar114._0_2_;
              auVar114._6_2_ = auVar114._0_2_;
              auVar114._8_2_ = auVar114._0_2_;
              auVar114._10_2_ = auVar114._0_2_;
              auVar114._12_2_ = auVar114._0_2_;
              auVar114._14_2_ = auVar114._0_2_;
              auVar114._16_2_ = auVar114._0_2_;
              auVar114._18_2_ = auVar114._0_2_;
              auVar114._20_2_ = auVar114._0_2_;
              auVar114._22_2_ = auVar114._0_2_;
              auVar114._24_2_ = auVar114._0_2_;
              auVar114._26_2_ = auVar114._0_2_;
              auVar114._28_2_ = auVar114._0_2_;
              auVar114._30_2_ = auVar114._0_2_;
              auVar96 = vpsllw_avx2(auVar114,ZEXT416((uint)upsample_left));
              auVar96 = vpsrlw_avx2(auVar96,1);
              auVar115 = vpand_avx2(auVar96,auVar97);
            }
            auVar96 = vpmovzxbw_avx2(auVar66);
            auVar104 = vpmovzxbw_avx2(auVar113);
            auVar104 = vpsubw_avx2(auVar104,auVar96);
            auVar104 = vpmullw_avx2(auVar104,auVar115);
            auVar96 = vpsllw_avx2(auVar96,5);
            auVar96 = vpaddw_avx2(auVar96,auVar78);
            auVar96 = vpaddw_avx2(auVar104,auVar96);
            auVar96 = vpsrlw_avx2(auVar96,5);
            auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
            auVar66 = vpblendvb_avx(auVar61,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
            *(undefined1 (*) [16])(local_1460 + lVar47) = auVar66;
            uVar53 = uVar53 + dy;
            uVar59 = uVar59 + 1;
            lVar47 = lVar47 + 0x10;
          } while (uVar59 != 4);
          auVar66 = vpunpcklbw_avx(local_1460._0_16_,stack0xffffffffffffebb0);
          auVar113 = vpunpcklbw_avx(local_1440._0_16_,local_1440._16_16_);
          local_1060 = vpunpcklwd_avx(auVar66,auVar113);
          local_1020 = vpunpckhwd_avx(auVar66,auVar113);
          auStack_1050 = vpsrldq_avx(local_1060,4);
          local_1040 = vpsrldq_avx(local_1060,8);
          auStack_1030 = vpsrldq_avx(local_1060,0xc);
          auStack_1010 = vpsrldq_avx(local_1020,4);
          local_1000 = vpsrldq_avx(local_1020,8);
          auStack_ff0 = vpsrldq_avx(local_1020,0xc);
          lVar47 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)(local_1060 + lVar47);
            lVar47 = lVar47 + 0x10;
            dst = dst + stride;
          } while (lVar47 != 0x80);
          return;
        case 1:
          iVar55 = 0x17 << (bVar49 & 0x1f);
          uVar1 = left[iVar55];
          auVar72[1] = uVar1;
          auVar72[0] = uVar1;
          auVar72[2] = uVar1;
          auVar72[3] = uVar1;
          auVar72[4] = uVar1;
          auVar72[5] = uVar1;
          auVar72[6] = uVar1;
          auVar72[7] = uVar1;
          auVar72[8] = uVar1;
          auVar72[9] = uVar1;
          auVar72[10] = uVar1;
          auVar72[0xb] = uVar1;
          auVar72[0xc] = uVar1;
          auVar72[0xd] = uVar1;
          auVar72[0xe] = uVar1;
          auVar72[0xf] = uVar1;
          lVar47 = 0;
          auVar90._8_2_ = 0x10;
          auVar90._0_8_ = 0x10001000100010;
          auVar90._10_2_ = 0x10;
          auVar90._12_2_ = 0x10;
          auVar90._14_2_ = 0x10;
          auVar90._16_2_ = 0x10;
          auVar90._18_2_ = 0x10;
          auVar90._20_2_ = 0x10;
          auVar90._22_2_ = 0x10;
          auVar90._24_2_ = 0x10;
          auVar90._26_2_ = 0x10;
          auVar90._28_2_ = 0x10;
          auVar90._30_2_ = 0x10;
          auVar110._8_2_ = 0x1f;
          auVar110._0_8_ = 0x1f001f001f001f;
          auVar110._10_2_ = 0x1f;
          auVar110._12_2_ = 0x1f;
          auVar110._14_2_ = 0x1f;
          auVar110._16_2_ = 0x1f;
          auVar110._18_2_ = 0x1f;
          auVar110._20_2_ = 0x1f;
          auVar110._22_2_ = 0x1f;
          auVar110._24_2_ = 0x1f;
          auVar110._26_2_ = 0x1f;
          auVar110._28_2_ = 0x1f;
          auVar110._30_2_ = 0x1f;
          uVar59 = 0;
          uVar53 = dy;
          do {
            iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
            uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
            if ((int)uVar57 < 1) {
              if (uVar59 < 8) {
                do {
                  *(undefined1 (*) [16])(local_1060 + lVar47) = auVar72;
                  lVar47 = lVar47 + 0x10;
                } while (lVar47 != 0x80);
              }
              break;
            }
            if (0xf < uVar57) {
              uVar57 = 0x10;
            }
            auVar66 = *(undefined1 (*) [16])(left + iVar54);
            if (upsample_left == 0) {
              auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
              uVar3 = (ushort)(uVar53 >> 1);
              uVar92 = uVar3 & 0x1f;
              auVar134._0_8_ =
                   CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
              auVar134._8_2_ = uVar92;
              auVar134._10_2_ = uVar92;
              auVar134._12_2_ = uVar92;
              auVar134._14_2_ = uVar92;
              auVar134._16_2_ = uVar92;
              auVar134._18_2_ = uVar92;
              auVar134._20_2_ = uVar92;
              auVar134._22_2_ = uVar92;
              auVar134._24_2_ = uVar92;
              auVar134._26_2_ = uVar92;
              auVar134._28_2_ = uVar92;
              auVar134._30_2_ = uVar92;
            }
            else {
              auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
              auVar113 = vpsrldq_avx(auVar66,8);
              auVar133._0_2_ = (undefined2)uVar53;
              auVar133._2_2_ = auVar133._0_2_;
              auVar133._4_2_ = auVar133._0_2_;
              auVar133._6_2_ = auVar133._0_2_;
              auVar133._8_2_ = auVar133._0_2_;
              auVar133._10_2_ = auVar133._0_2_;
              auVar133._12_2_ = auVar133._0_2_;
              auVar133._14_2_ = auVar133._0_2_;
              auVar133._16_2_ = auVar133._0_2_;
              auVar133._18_2_ = auVar133._0_2_;
              auVar133._20_2_ = auVar133._0_2_;
              auVar133._22_2_ = auVar133._0_2_;
              auVar133._24_2_ = auVar133._0_2_;
              auVar133._26_2_ = auVar133._0_2_;
              auVar133._28_2_ = auVar133._0_2_;
              auVar133._30_2_ = auVar133._0_2_;
              auVar96 = vpsllw_avx2(auVar133,ZEXT416((uint)upsample_left));
              auVar96 = vpsrlw_avx2(auVar96,1);
              auVar134 = vpand_avx2(auVar96,auVar110);
            }
            auVar96 = vpmovzxbw_avx2(auVar66);
            auVar104 = vpmovzxbw_avx2(auVar113);
            auVar104 = vpsubw_avx2(auVar104,auVar96);
            auVar104 = vpmullw_avx2(auVar104,auVar134);
            auVar96 = vpsllw_avx2(auVar96,5);
            auVar96 = vpaddw_avx2(auVar96,auVar90);
            auVar96 = vpaddw_avx2(auVar104,auVar96);
            auVar96 = vpsrlw_avx2(auVar96,5);
            auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
            auVar66 = vpblendvb_avx(auVar72,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
            *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
            uVar53 = uVar53 + dy;
            uVar59 = uVar59 + 1;
            lVar47 = lVar47 + 0x10;
          } while (uVar59 != 8);
          auVar61 = vpunpcklbw_avx(local_1060,auStack_1050);
          auVar67 = vpunpcklbw_avx(local_1040,auStack_1030);
          auVar63 = vpunpcklbw_avx(local_1020,auStack_1010);
          auVar69 = vpunpcklbw_avx(local_1000,auStack_ff0);
          auVar66 = vpunpckhbw_avx(local_1060,auStack_1050);
          auVar113 = vpunpckhbw_avx(local_1040,auStack_1030);
          auVar112 = vpunpckhbw_avx(local_1020,auStack_1010);
          auVar65 = vpunpckhbw_avx(local_1000,auStack_ff0);
          auVar70 = vpunpcklwd_avx(auVar61,auVar67);
          auVar72 = vpunpcklwd_avx(auVar63,auVar69);
          auVar68 = vpunpcklwd_avx(auVar66,auVar113);
          auVar64 = vpunpcklwd_avx(auVar112,auVar65);
          auVar71 = vpunpckldq_avx(auVar70,auVar72);
          auVar70 = vpunpckhdq_avx(auVar70,auVar72);
          auVar73 = vpunpckldq_avx(auVar68,auVar64);
          auVar72 = vpunpckhdq_avx(auVar68,auVar64);
          local_1460._0_16_ = vpunpcklqdq_avx(auVar71,auVar73);
          unique0x00102d80 = vpunpckhqdq_avx(auVar71,auVar73);
          local_1440._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
          local_1440._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
          auVar70 = vpunpckhwd_avx(auVar61,auVar67);
          auVar72 = vpunpckhwd_avx(auVar63,auVar69);
          auVar66 = vpunpckhwd_avx(auVar66,auVar113);
          auVar113 = vpunpckhwd_avx(auVar112,auVar65);
          auVar65 = vpunpckldq_avx(auVar70,auVar72);
          auVar112 = vpunpckhdq_avx(auVar70,auVar72);
          auVar70 = vpunpckldq_avx(auVar66,auVar113);
          auVar66 = vpunpckhdq_avx(auVar66,auVar113);
          local_1420._0_16_ = vpunpcklqdq_avx(auVar65,auVar70);
          local_1420._16_16_ = vpunpckhqdq_avx(auVar65,auVar70);
          local_1400._0_16_ = vpunpcklqdq_avx(auVar112,auVar66);
          local_1400._16_16_ = vpunpckhqdq_avx(auVar112,auVar66);
          lVar47 = 0;
          do {
            *(undefined8 *)dst = *(undefined8 *)(local_1460 + lVar47);
            *(undefined8 *)(dst + stride * 8) = *(undefined8 *)(local_1460 + lVar47 + 8);
            dst = dst + stride;
            lVar47 = lVar47 + 0x10;
          } while (lVar47 != 0x80);
          return;
        default:
          return;
        case 3:
          uVar1 = left[0x2f];
          auVar70[1] = uVar1;
          auVar70[0] = uVar1;
          auVar70[2] = uVar1;
          auVar70[3] = uVar1;
          auVar70[4] = uVar1;
          auVar70[5] = uVar1;
          auVar70[6] = uVar1;
          auVar70[7] = uVar1;
          auVar70[8] = uVar1;
          auVar70[9] = uVar1;
          auVar70[10] = uVar1;
          auVar70[0xb] = uVar1;
          auVar70[0xc] = uVar1;
          auVar70[0xd] = uVar1;
          auVar70[0xe] = uVar1;
          auVar70[0xf] = uVar1;
          auVar77[0x10] = uVar1;
          auVar77._0_16_ = auVar70;
          auVar77[0x11] = uVar1;
          auVar77[0x12] = uVar1;
          auVar77[0x13] = uVar1;
          auVar77[0x14] = uVar1;
          auVar77[0x15] = uVar1;
          auVar77[0x16] = uVar1;
          auVar77[0x17] = uVar1;
          auVar77[0x18] = uVar1;
          auVar77[0x19] = uVar1;
          auVar77[0x1a] = uVar1;
          auVar77[0x1b] = uVar1;
          auVar77[0x1c] = uVar1;
          auVar77[0x1d] = uVar1;
          auVar77[0x1e] = uVar1;
          auVar77[0x1f] = uVar1;
          lVar47 = 0;
          auVar88._8_2_ = 0x10;
          auVar88._0_8_ = 0x10001000100010;
          auVar88._10_2_ = 0x10;
          auVar88._12_2_ = 0x10;
          auVar88._14_2_ = 0x10;
          auVar88._16_2_ = 0x10;
          auVar88._18_2_ = 0x10;
          auVar88._20_2_ = 0x10;
          auVar88._22_2_ = 0x10;
          auVar88._24_2_ = 0x10;
          auVar88._26_2_ = 0x10;
          auVar88._28_2_ = 0x10;
          auVar88._30_2_ = 0x10;
          lVar52 = 0;
          uVar53 = dy;
          do {
            iVar55 = (int)uVar53 >> 6;
            lVar50 = lVar47;
            if (iVar55 < 0x2f) {
              uVar57 = -(iVar55 + -0x2f);
              uVar3 = (ushort)(uVar53 >> 1);
              uVar92 = uVar3 & 0x1f;
              auVar95._0_8_ =
                   CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
              auVar95._8_2_ = uVar92;
              auVar95._10_2_ = uVar92;
              auVar95._12_2_ = uVar92;
              auVar95._14_2_ = uVar92;
              auVar95._16_2_ = uVar92;
              auVar95._18_2_ = uVar92;
              auVar95._20_2_ = uVar92;
              auVar95._22_2_ = uVar92;
              auVar95._24_2_ = uVar92;
              auVar95._26_2_ = uVar92;
              auVar95._28_2_ = uVar92;
              auVar95._30_2_ = uVar92;
              lVar58 = 0;
              lVar50 = 0;
              do {
                auVar96 = auVar77;
                if (lVar50 < (int)uVar57) {
                  auVar96 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar50 + iVar55));
                  auVar104 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar50 + (long)iVar55 + 1)
                                           );
                  auVar104 = vpsubw_avx2(auVar104,auVar96);
                  auVar104 = vpmullw_avx2(auVar104,auVar95);
                  auVar96 = vpsllw_avx2(auVar96,5);
                  auVar96 = vpaddw_avx2(auVar96,auVar88);
                  auVar96 = vpaddw_avx2(auVar104,auVar96);
                  auVar96 = vpsrlw_avx2(auVar96,5);
                  auVar108._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar96._16_16_;
                  auVar108._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70;
                  auVar96 = vpackuswb_avx2(auVar96,auVar108);
                }
                *(undefined1 (*) [32])(local_1460 + lVar58) = auVar96;
                lVar58 = lVar58 + 0x20;
                lVar50 = 0x10;
              } while (lVar58 != 0x40);
              if (0x1f < uVar57) {
                uVar57 = 0x20;
              }
              auVar96 = vperm2i128_avx2(_local_1460,local_1440,0x20);
              auVar96 = vpblendvb_avx2(auVar77,auVar96,
                                       *(undefined1 (*) [32])(BaseMask[0] + (uVar57 << 5)));
              *(undefined1 (*) [32])(local_1060 + lVar52 * 0x20) = auVar96;
              uVar53 = uVar53 + dy;
            }
            else {
              do {
                *(undefined1 (*) [32])(local_1060 + lVar50) = auVar77;
                lVar50 = lVar50 + 0x20;
              } while (lVar50 != 0x200);
            }
            if (0x2e < iVar55) break;
            lVar52 = lVar52 + 1;
            lVar47 = lVar47 + 0x20;
          } while (lVar52 != 0x10);
          auVar8._16_16_ = auStack_1050;
          auVar8._0_16_ = local_1060;
          auVar11._16_16_ = auStack_1030;
          auVar11._0_16_ = local_1040;
          auVar14._16_16_ = auStack_1010;
          auVar14._0_16_ = local_1020;
          auVar17._16_16_ = auStack_ff0;
          auVar17._0_16_ = local_1000;
          auVar126 = vpunpcklbw_avx2(auVar8,auVar11);
          auVar125 = vpunpcklbw_avx2(auVar14,auVar17);
          auVar20._16_16_ = auStack_fd0;
          auVar20._0_16_ = local_fe0;
          auVar23._16_16_ = auStack_fb0;
          auVar23._0_16_ = local_fc0;
          auVar80 = vpunpcklbw_avx2(auVar20,auVar23);
          auVar26._16_16_ = auStack_f90;
          auVar26._0_16_ = local_fa0;
          auVar29._16_16_ = auStack_f70;
          auVar29._0_16_ = local_f80;
          auVar99 = vpunpcklbw_avx2(auVar26,auVar29);
          auVar31._16_16_ = auStack_f50;
          auVar31._0_16_ = local_f60;
          auVar96 = vpunpcklwd_avx2(auVar126,auVar125);
          auVar104 = vpunpcklwd_avx2(auVar80,auVar99);
          auVar123 = vpunpckldq_avx2(auVar96,auVar104);
          auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
          auVar33._16_16_ = auStack_f30;
          auVar33._0_16_ = local_f40;
          auVar118 = vpunpcklbw_avx2(auVar31,auVar33);
          auVar35._16_16_ = auStack_f10;
          auVar35._0_16_ = local_f20;
          auVar37._16_16_ = auStack_ef0;
          auVar37._0_16_ = local_f00;
          auVar76 = vpunpcklbw_avx2(auVar35,auVar37);
          auVar39._16_16_ = auStack_ed0;
          auVar39._0_16_ = local_ee0;
          auVar41._16_16_ = auStack_eb0;
          auVar41._0_16_ = local_ec0;
          auVar83 = vpunpcklbw_avx2(auVar39,auVar41);
          auVar43._16_16_ = auStack_e90;
          auVar43._0_16_ = local_ea0;
          auVar45._16_16_ = auStack_e70;
          auVar45._0_16_ = local_e80;
          auVar102 = vpunpcklbw_avx2(auVar43,auVar45);
          auVar104 = vpunpcklwd_avx2(auVar118,auVar76);
          auVar124 = vpunpcklwd_avx2(auVar83,auVar102);
          auVar74 = vpunpckldq_avx2(auVar104,auVar124);
          auVar104 = vpunpckhdq_avx2(auVar104,auVar124);
          _local_1460 = vpunpcklqdq_avx2(auVar123,auVar74);
          local_1440 = vpunpckhqdq_avx2(auVar123,auVar74);
          local_1420 = vpunpcklqdq_avx2(auVar96,auVar104);
          local_1400 = vpunpckhqdq_avx2(auVar96,auVar104);
          auVar96 = vpunpckhwd_avx2(auVar126,auVar125);
          auVar104 = vpunpckhwd_avx2(auVar80,auVar99);
          auVar126 = vpunpckhwd_avx2(auVar118,auVar76);
          auVar125 = vpunpckhwd_avx2(auVar83,auVar102);
          auVar80 = vpunpckldq_avx2(auVar96,auVar104);
          auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
          auVar99 = vpunpckldq_avx2(auVar126,auVar125);
          auVar104 = vpunpckhdq_avx2(auVar126,auVar125);
          local_13e0 = vpunpcklqdq_avx2(auVar80,auVar99);
          local_13c0 = vpunpckhqdq_avx2(auVar80,auVar99);
          local_13a0 = vpunpcklqdq_avx2(auVar96,auVar104);
          local_1380 = vpunpckhqdq_avx2(auVar96,auVar104);
          auVar96 = vpunpckhbw_avx2(auVar8,auVar11);
          auVar104 = vpunpckhbw_avx2(auVar14,auVar17);
          auVar126 = vpunpckhbw_avx2(auVar20,auVar23);
          auVar125 = vpunpckhbw_avx2(auVar26,auVar29);
          auVar80 = vpunpckhbw_avx2(auVar31,auVar33);
          auVar99 = vpunpckhbw_avx2(auVar35,auVar37);
          auVar118 = vpunpckhbw_avx2(auVar39,auVar41);
          auVar76 = vpunpckhbw_avx2(auVar43,auVar45);
          auVar83 = vpunpcklwd_avx2(auVar96,auVar104);
          auVar102 = vpunpcklwd_avx2(auVar126,auVar125);
          auVar124 = vpunpcklwd_avx2(auVar80,auVar99);
          auVar123 = vpunpcklwd_avx2(auVar118,auVar76);
          auVar74 = vpunpckldq_avx2(auVar83,auVar102);
          auVar83 = vpunpckhdq_avx2(auVar83,auVar102);
          auVar84 = vpunpckldq_avx2(auVar124,auVar123);
          auVar102 = vpunpckhdq_avx2(auVar124,auVar123);
          local_1360 = vpunpcklqdq_avx2(auVar74,auVar84);
          local_1340 = vpunpckhqdq_avx2(auVar74,auVar84);
          local_1320 = vpunpcklqdq_avx2(auVar83,auVar102);
          local_1300 = vpunpckhqdq_avx2(auVar83,auVar102);
          auVar96 = vpunpckhwd_avx2(auVar96,auVar104);
          auVar104 = vpunpckhwd_avx2(auVar126,auVar125);
          auVar126 = vpunpckhwd_avx2(auVar80,auVar99);
          auVar125 = vpunpckhwd_avx2(auVar118,auVar76);
          auVar80 = vpunpckldq_avx2(auVar96,auVar104);
          auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
          auVar99 = vpunpckldq_avx2(auVar126,auVar125);
          auVar104 = vpunpckhdq_avx2(auVar126,auVar125);
          local_12e0 = vpunpcklqdq_avx2(auVar80,auVar99);
          local_12c0 = vpunpckhqdq_avx2(auVar80,auVar99);
          local_12a0 = vpunpcklqdq_avx2(auVar96,auVar104);
          local_1280 = vpunpckhqdq_avx2(auVar96,auVar104);
          lVar47 = 0;
          do {
            uVar2 = *(undefined8 *)(local_1460 + lVar47 + 8);
            uVar4 = *(undefined8 *)(local_1460 + lVar47 + 0x10);
            uVar5 = *(undefined8 *)(local_1440 + lVar47 + -8);
            *(undefined8 *)dst = *(undefined8 *)(local_1460 + lVar47);
            *(undefined8 *)(dst + 8) = uVar2;
            *(undefined8 *)(dst + stride * 0x10 + 0x10) = uVar4;
            *(undefined8 *)(dst + stride * 0x10 + 0x18) = uVar5;
            dst = dst + stride;
            lVar47 = lVar47 + 0x20;
          } while (lVar47 != 0x200);
          return;
        case 7:
          uStack_1608 = 0x35ae5d;
          dr_prediction_z1_64xN_avx2(0x20,local_1060,0x40,left,dy,iVar55);
          iVar55 = 0x20;
        }
      }
      else {
        if (bw != 0x10) {
          if (bw == 8) {
            uVar1 = left[0x27];
            auVar67[1] = uVar1;
            auVar67[0] = uVar1;
            auVar67[2] = uVar1;
            auVar67[3] = uVar1;
            auVar67[4] = uVar1;
            auVar67[5] = uVar1;
            auVar67[6] = uVar1;
            auVar67[7] = uVar1;
            auVar67[8] = uVar1;
            auVar67[9] = uVar1;
            auVar67[10] = uVar1;
            auVar67[0xb] = uVar1;
            auVar67[0xc] = uVar1;
            auVar67[0xd] = uVar1;
            auVar67[0xe] = uVar1;
            auVar67[0xf] = uVar1;
            auVar75[0x10] = uVar1;
            auVar75._0_16_ = auVar67;
            auVar75[0x11] = uVar1;
            auVar75[0x12] = uVar1;
            auVar75[0x13] = uVar1;
            auVar75[0x14] = uVar1;
            auVar75[0x15] = uVar1;
            auVar75[0x16] = uVar1;
            auVar75[0x17] = uVar1;
            auVar75[0x18] = uVar1;
            auVar75[0x19] = uVar1;
            auVar75[0x1a] = uVar1;
            auVar75[0x1b] = uVar1;
            auVar75[0x1c] = uVar1;
            auVar75[0x1d] = uVar1;
            auVar75[0x1e] = uVar1;
            auVar75[0x1f] = uVar1;
            lVar47 = 0;
            auVar85._8_2_ = 0x10;
            auVar85._0_8_ = 0x10001000100010;
            auVar85._10_2_ = 0x10;
            auVar85._12_2_ = 0x10;
            auVar85._14_2_ = 0x10;
            auVar85._16_2_ = 0x10;
            auVar85._18_2_ = 0x10;
            auVar85._20_2_ = 0x10;
            auVar85._22_2_ = 0x10;
            auVar85._24_2_ = 0x10;
            auVar85._26_2_ = 0x10;
            auVar85._28_2_ = 0x10;
            auVar85._30_2_ = 0x10;
            lVar52 = 0;
            uVar53 = dy;
            do {
              iVar55 = (int)uVar53 >> 6;
              lVar50 = lVar47;
              if (iVar55 < 0x27) {
                uVar57 = -(iVar55 + -0x27);
                uVar3 = (ushort)(uVar53 >> 1);
                uVar92 = uVar3 & 0x1f;
                auVar94._0_8_ =
                     CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
                auVar94._8_2_ = uVar92;
                auVar94._10_2_ = uVar92;
                auVar94._12_2_ = uVar92;
                auVar94._14_2_ = uVar92;
                auVar94._16_2_ = uVar92;
                auVar94._18_2_ = uVar92;
                auVar94._20_2_ = uVar92;
                auVar94._22_2_ = uVar92;
                auVar94._24_2_ = uVar92;
                auVar94._26_2_ = uVar92;
                auVar94._28_2_ = uVar92;
                auVar94._30_2_ = uVar92;
                lVar58 = 0;
                lVar50 = 0;
                do {
                  auVar96 = auVar75;
                  if (lVar50 < (int)uVar57) {
                    auVar96 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar50 + iVar55));
                    auVar104 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                               (left + lVar50 + (long)iVar55 + 1));
                    auVar104 = vpsubw_avx2(auVar104,auVar96);
                    auVar104 = vpmullw_avx2(auVar104,auVar94);
                    auVar96 = vpsllw_avx2(auVar96,5);
                    auVar96 = vpaddw_avx2(auVar96,auVar85);
                    auVar96 = vpaddw_avx2(auVar104,auVar96);
                    auVar96 = vpsrlw_avx2(auVar96,5);
                    auVar105._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar96._16_16_;
                    auVar105._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
                    auVar96 = vpackuswb_avx2(auVar96,auVar105);
                  }
                  *(undefined1 (*) [32])(local_1460 + lVar58) = auVar96;
                  lVar58 = lVar58 + 0x20;
                  lVar50 = 0x10;
                } while (lVar58 != 0x40);
                if (0x1f < uVar57) {
                  uVar57 = 0x20;
                }
                auVar96 = vperm2i128_avx2(_local_1460,local_1440,0x20);
                auVar96 = vpblendvb_avx2(auVar75,auVar96,
                                         *(undefined1 (*) [32])(BaseMask[0] + (uVar57 << 5)));
                *(undefined1 (*) [32])(local_1060 + lVar52 * 0x20) = auVar96;
                uVar53 = uVar53 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [32])(local_1060 + lVar50) = auVar75;
                  lVar50 = lVar50 + 0x20;
                } while (lVar50 != 0x100);
              }
              if (0x26 < iVar55) break;
              lVar52 = lVar52 + 1;
              lVar47 = lVar47 + 0x20;
            } while (lVar52 != 8);
            auVar7._16_16_ = auStack_1050;
            auVar7._0_16_ = local_1060;
            auVar10._16_16_ = auStack_1030;
            auVar10._0_16_ = local_1040;
            auVar13._16_16_ = auStack_1010;
            auVar13._0_16_ = local_1020;
            auVar16._16_16_ = auStack_ff0;
            auVar16._0_16_ = local_1000;
            auVar104 = vpunpcklbw_avx2(auVar7,auVar10);
            auVar126 = vpunpcklbw_avx2(auVar13,auVar16);
            auVar19._16_16_ = auStack_fd0;
            auVar19._0_16_ = local_fe0;
            auVar22._16_16_ = auStack_fb0;
            auVar22._0_16_ = local_fc0;
            auVar125 = vpunpcklbw_avx2(auVar19,auVar22);
            auVar25._16_16_ = auStack_f90;
            auVar25._0_16_ = local_fa0;
            auVar28._16_16_ = auStack_f70;
            auVar28._0_16_ = local_f80;
            auVar80 = vpunpcklbw_avx2(auVar25,auVar28);
            auVar96 = vpunpcklwd_avx2(auVar104,auVar126);
            auVar99 = vpunpcklwd_avx2(auVar125,auVar80);
            auVar118 = vpunpckldq_avx2(auVar96,auVar99);
            auVar96 = vpunpckhdq_avx2(auVar96,auVar99);
            auVar76 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            _local_1460 = vpblendd_avx2(auVar118,auVar76,0xcc);
            local_1440 = vpsrldq_avx2(auVar118,8);
            local_1420 = vpblendd_avx2(auVar96,auVar76,0xcc);
            local_1400 = vpsrldq_avx2(auVar96,8);
            auVar96 = vpunpckhwd_avx2(auVar104,auVar126);
            auVar104 = vpunpckhwd_avx2(auVar125,auVar80);
            auVar126 = vpunpckldq_avx2(auVar96,auVar104);
            auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
            local_13e0 = vpblendd_avx2(auVar126,auVar76,0xcc);
            local_13c0 = vpsrldq_avx2(auVar126,8);
            local_13a0 = vpblendd_avx2(auVar96,auVar76,0xcc);
            local_1380 = vpsrldq_avx2(auVar96,8);
            auVar96 = vpunpckhbw_avx2(auVar7,auVar10);
            auVar104 = vpunpckhbw_avx2(auVar13,auVar16);
            auVar126 = vpunpckhbw_avx2(auVar19,auVar22);
            auVar125 = vpunpckhbw_avx2(auVar25,auVar28);
            auVar80 = vpunpcklwd_avx2(auVar96,auVar104);
            auVar99 = vpunpcklwd_avx2(auVar126,auVar125);
            auVar118 = vpunpckldq_avx2(auVar80,auVar99);
            auVar80 = vpunpckhdq_avx2(auVar80,auVar99);
            local_1360 = vpblendd_avx2(auVar118,auVar76,0xcc);
            local_1340 = vpsrldq_avx2(auVar118,8);
            local_1320 = vpblendd_avx2(auVar80,auVar76,0xcc);
            local_1300 = vpsrldq_avx2(auVar80,8);
            auVar96 = vpunpckhwd_avx2(auVar96,auVar104);
            auVar104 = vpunpckhwd_avx2(auVar126,auVar125);
            auVar126 = vpunpckldq_avx2(auVar96,auVar104);
            auVar96 = vpunpckhdq_avx2(auVar96,auVar104);
            local_12e0 = vpblendd_avx2(auVar126,auVar76,0xcc);
            local_12c0 = vpsrldq_avx2(auVar126,8);
            local_12a0 = vpblendd_avx2(auVar96,auVar76,0xcc);
            local_1280 = vpsrldq_avx2(auVar96,8);
            lVar47 = 0;
            puVar48 = dst;
            do {
              *(undefined8 *)puVar48 = *(undefined8 *)(local_1460 + lVar47);
              lVar47 = lVar47 + 0x20;
              puVar48 = puVar48 + stride;
            } while (lVar47 != 0x200);
            puVar48 = dst + stride * 0x10;
            lVar47 = 0x10;
            do {
              *(undefined8 *)puVar48 = *(undefined8 *)(local_1460 + lVar47);
              puVar48 = puVar48 + stride;
              lVar47 = lVar47 + 0x20;
            } while (lVar47 != 0x210);
            return;
          }
          if (bw != 4) {
            return;
          }
          iVar55 = 0x13 << (bVar49 & 0x1f);
          uVar1 = left[iVar55];
          auVar63[1] = uVar1;
          auVar63[0] = uVar1;
          auVar63[2] = uVar1;
          auVar63[3] = uVar1;
          auVar63[4] = uVar1;
          auVar63[5] = uVar1;
          auVar63[6] = uVar1;
          auVar63[7] = uVar1;
          auVar63[8] = uVar1;
          auVar63[9] = uVar1;
          auVar63[10] = uVar1;
          auVar63[0xb] = uVar1;
          auVar63[0xc] = uVar1;
          auVar63[0xd] = uVar1;
          auVar63[0xe] = uVar1;
          auVar63[0xf] = uVar1;
          lVar47 = 0;
          auVar81._8_2_ = 0x10;
          auVar81._0_8_ = 0x10001000100010;
          auVar81._10_2_ = 0x10;
          auVar81._12_2_ = 0x10;
          auVar81._14_2_ = 0x10;
          auVar81._16_2_ = 0x10;
          auVar81._18_2_ = 0x10;
          auVar81._20_2_ = 0x10;
          auVar81._22_2_ = 0x10;
          auVar81._24_2_ = 0x10;
          auVar81._26_2_ = 0x10;
          auVar81._28_2_ = 0x10;
          auVar81._30_2_ = 0x10;
          auVar100._8_2_ = 0x1f;
          auVar100._0_8_ = 0x1f001f001f001f;
          auVar100._10_2_ = 0x1f;
          auVar100._12_2_ = 0x1f;
          auVar100._14_2_ = 0x1f;
          auVar100._16_2_ = 0x1f;
          auVar100._18_2_ = 0x1f;
          auVar100._20_2_ = 0x1f;
          auVar100._22_2_ = 0x1f;
          auVar100._24_2_ = 0x1f;
          auVar100._26_2_ = 0x1f;
          auVar100._28_2_ = 0x1f;
          auVar100._30_2_ = 0x1f;
          uVar59 = 0;
          uVar53 = dy;
          do {
            iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
            uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
            if ((int)uVar57 < 1) {
              if (uVar59 < 4) {
                do {
                  *(undefined1 (*) [16])(local_1460 + lVar47) = auVar63;
                  lVar47 = lVar47 + 0x10;
                } while (lVar47 != 0x40);
              }
              break;
            }
            if (0xf < uVar57) {
              uVar57 = 0x10;
            }
            auVar66 = *(undefined1 (*) [16])(left + iVar54);
            if (upsample_left == 0) {
              auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
              uVar3 = (ushort)(uVar53 >> 1);
              uVar92 = uVar3 & 0x1f;
              auVar120._0_8_ =
                   CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
              auVar120._8_2_ = uVar92;
              auVar120._10_2_ = uVar92;
              auVar120._12_2_ = uVar92;
              auVar120._14_2_ = uVar92;
              auVar120._16_2_ = uVar92;
              auVar120._18_2_ = uVar92;
              auVar120._20_2_ = uVar92;
              auVar120._22_2_ = uVar92;
              auVar120._24_2_ = uVar92;
              auVar120._26_2_ = uVar92;
              auVar120._28_2_ = uVar92;
              auVar120._30_2_ = uVar92;
            }
            else {
              auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
              auVar113 = vpsrldq_avx(auVar66,8);
              auVar119._0_2_ = (undefined2)uVar53;
              auVar119._2_2_ = auVar119._0_2_;
              auVar119._4_2_ = auVar119._0_2_;
              auVar119._6_2_ = auVar119._0_2_;
              auVar119._8_2_ = auVar119._0_2_;
              auVar119._10_2_ = auVar119._0_2_;
              auVar119._12_2_ = auVar119._0_2_;
              auVar119._14_2_ = auVar119._0_2_;
              auVar119._16_2_ = auVar119._0_2_;
              auVar119._18_2_ = auVar119._0_2_;
              auVar119._20_2_ = auVar119._0_2_;
              auVar119._22_2_ = auVar119._0_2_;
              auVar119._24_2_ = auVar119._0_2_;
              auVar119._26_2_ = auVar119._0_2_;
              auVar119._28_2_ = auVar119._0_2_;
              auVar119._30_2_ = auVar119._0_2_;
              auVar96 = vpsllw_avx2(auVar119,ZEXT416((uint)upsample_left));
              auVar96 = vpsrlw_avx2(auVar96,1);
              auVar120 = vpand_avx2(auVar96,auVar100);
            }
            auVar96 = vpmovzxbw_avx2(auVar66);
            auVar104 = vpmovzxbw_avx2(auVar113);
            auVar104 = vpsubw_avx2(auVar104,auVar96);
            auVar104 = vpmullw_avx2(auVar104,auVar120);
            auVar96 = vpsllw_avx2(auVar96,5);
            auVar96 = vpaddw_avx2(auVar96,auVar81);
            auVar96 = vpaddw_avx2(auVar104,auVar96);
            auVar96 = vpsrlw_avx2(auVar96,5);
            auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
            auVar66 = vpblendvb_avx(auVar63,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
            *(undefined1 (*) [16])(local_1460 + lVar47) = auVar66;
            uVar53 = uVar53 + dy;
            uVar59 = uVar59 + 1;
            lVar47 = lVar47 + 0x10;
          } while (uVar59 != 4);
          auVar112 = vpunpcklbw_avx(local_1460._0_16_,stack0xffffffffffffebb0);
          auVar65 = vpunpcklbw_avx(local_1440._0_16_,local_1440._16_16_);
          auVar66 = vpunpckhbw_avx(local_1460._0_16_,stack0xffffffffffffebb0);
          auVar113 = vpunpckhbw_avx(local_1440._0_16_,local_1440._16_16_);
          auVar70 = vpunpcklwd_avx(auVar112,auVar65);
          auVar72 = vpunpcklwd_avx(auVar66,auVar113);
          auVar112 = vpunpckhwd_avx(auVar112,auVar65);
          auVar66 = vpunpckhwd_avx(auVar66,auVar113);
          auVar65 = vpunpckldq_avx(auVar70,auVar72);
          auVar61 = vpunpckldq_avx(auVar112,auVar66);
          auVar113 = vpunpckhdq_avx(auVar70,auVar72);
          auVar66 = vpunpckhdq_avx(auVar112,auVar66);
          local_1060 = vpunpcklqdq_avx(auVar65,auVar61);
          auStack_1050 = vpunpckhqdq_avx(auVar65,auVar61);
          local_1040 = vpunpcklqdq_avx(auVar113,auVar66);
          auStack_1030 = vpunpckhqdq_avx(auVar113,auVar66);
          local_1020 = vpsrldq_avx(local_1060,8);
          auStack_1010 = vpsrldq_avx(auStack_1050,8);
          local_1000 = vpsrldq_avx(local_1040,8);
          auStack_ff0 = vpsrldq_avx(auStack_1030,8);
          local_fe0 = vpsrldq_avx(local_1060,4);
          auStack_fd0 = vpsrldq_avx(auStack_1050,4);
          local_fc0 = vpsrldq_avx(local_1040,4);
          auStack_fb0 = vpsrldq_avx(auStack_1030,4);
          local_fa0 = vpsrldq_avx(local_1060,0xc);
          auStack_f90 = vpsrldq_avx(auStack_1050,0xc);
          local_f80 = vpsrldq_avx(local_1040,0xc);
          auStack_f70 = vpsrldq_avx(auStack_1030,0xc);
          lVar47 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)(local_1060 + lVar47);
            lVar47 = lVar47 + 0x10;
            dst = dst + stride;
          } while (lVar47 != 0x100);
          return;
        }
        uStack_1608 = 0x35a56c;
        dr_prediction_z1_64xN_avx2(0x10,local_1060,0x40,left,dy,iVar55);
        iVar55 = 0x10;
      }
      goto LAB_0035ae71;
    }
    if (bh * 2 != bw) {
      if (bh == 0x10) {
        iVar55 = 0x4f << (bVar49 & 0x1f);
        uVar1 = left[iVar55];
        auVar69[1] = uVar1;
        auVar69[0] = uVar1;
        auVar69[2] = uVar1;
        auVar69[3] = uVar1;
        auVar69[4] = uVar1;
        auVar69[5] = uVar1;
        auVar69[6] = uVar1;
        auVar69[7] = uVar1;
        auVar69[8] = uVar1;
        auVar69[9] = uVar1;
        auVar69[10] = uVar1;
        auVar69[0xb] = uVar1;
        auVar69[0xc] = uVar1;
        auVar69[0xd] = uVar1;
        auVar69[0xe] = uVar1;
        auVar69[0xf] = uVar1;
        lVar47 = 0;
        auVar87._8_2_ = 0x10;
        auVar87._0_8_ = 0x10001000100010;
        auVar87._10_2_ = 0x10;
        auVar87._12_2_ = 0x10;
        auVar87._14_2_ = 0x10;
        auVar87._16_2_ = 0x10;
        auVar87._18_2_ = 0x10;
        auVar87._20_2_ = 0x10;
        auVar87._22_2_ = 0x10;
        auVar87._24_2_ = 0x10;
        auVar87._26_2_ = 0x10;
        auVar87._28_2_ = 0x10;
        auVar87._30_2_ = 0x10;
        auVar107._8_2_ = 0x1f;
        auVar107._0_8_ = 0x1f001f001f001f;
        auVar107._10_2_ = 0x1f;
        auVar107._12_2_ = 0x1f;
        auVar107._14_2_ = 0x1f;
        auVar107._16_2_ = 0x1f;
        auVar107._18_2_ = 0x1f;
        auVar107._20_2_ = 0x1f;
        auVar107._22_2_ = 0x1f;
        auVar107._24_2_ = 0x1f;
        auVar107._26_2_ = 0x1f;
        auVar107._28_2_ = 0x1f;
        auVar107._30_2_ = 0x1f;
        uVar59 = 0;
        uVar53 = dy;
        do {
          iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
          uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
          if ((int)uVar57 < 1) {
            if (uVar59 < 0x40) {
              do {
                *(undefined1 (*) [16])(local_1060 + lVar47) = auVar69;
                lVar47 = lVar47 + 0x10;
              } while (lVar47 != 0x400);
            }
            break;
          }
          if (0xf < uVar57) {
            uVar57 = 0x10;
          }
          auVar66 = *(undefined1 (*) [16])(left + iVar54);
          if (upsample_left == 0) {
            auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
            uVar3 = (ushort)(uVar53 >> 1);
            uVar92 = uVar3 & 0x1f;
            auVar130._0_8_ =
                 CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
            auVar130._8_2_ = uVar92;
            auVar130._10_2_ = uVar92;
            auVar130._12_2_ = uVar92;
            auVar130._14_2_ = uVar92;
            auVar130._16_2_ = uVar92;
            auVar130._18_2_ = uVar92;
            auVar130._20_2_ = uVar92;
            auVar130._22_2_ = uVar92;
            auVar130._24_2_ = uVar92;
            auVar130._26_2_ = uVar92;
            auVar130._28_2_ = uVar92;
            auVar130._30_2_ = uVar92;
          }
          else {
            auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
            auVar113 = vpsrldq_avx(auVar66,8);
            auVar129._0_2_ = (undefined2)uVar53;
            auVar129._2_2_ = auVar129._0_2_;
            auVar129._4_2_ = auVar129._0_2_;
            auVar129._6_2_ = auVar129._0_2_;
            auVar129._8_2_ = auVar129._0_2_;
            auVar129._10_2_ = auVar129._0_2_;
            auVar129._12_2_ = auVar129._0_2_;
            auVar129._14_2_ = auVar129._0_2_;
            auVar129._16_2_ = auVar129._0_2_;
            auVar129._18_2_ = auVar129._0_2_;
            auVar129._20_2_ = auVar129._0_2_;
            auVar129._22_2_ = auVar129._0_2_;
            auVar129._24_2_ = auVar129._0_2_;
            auVar129._26_2_ = auVar129._0_2_;
            auVar129._28_2_ = auVar129._0_2_;
            auVar129._30_2_ = auVar129._0_2_;
            auVar96 = vpsllw_avx2(auVar129,ZEXT416((uint)upsample_left));
            auVar96 = vpsrlw_avx2(auVar96,1);
            auVar130 = vpand_avx2(auVar96,auVar107);
          }
          auVar96 = vpmovzxbw_avx2(auVar66);
          auVar104 = vpmovzxbw_avx2(auVar113);
          auVar104 = vpsubw_avx2(auVar104,auVar96);
          auVar104 = vpmullw_avx2(auVar104,auVar130);
          auVar96 = vpsllw_avx2(auVar96,5);
          auVar96 = vpaddw_avx2(auVar96,auVar87);
          auVar96 = vpaddw_avx2(auVar104,auVar96);
          auVar96 = vpsrlw_avx2(auVar96,5);
          auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
          auVar66 = vpblendvb_avx(auVar69,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
          *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
          uVar53 = uVar53 + dy;
          uVar59 = uVar59 + 1;
          lVar47 = lVar47 + 0x10;
        } while (uVar59 != 0x40);
        uVar59 = 0;
        do {
          lVar47 = uVar59 * 0x10;
          auVar112 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1060 + lVar47),
                                    *(undefined1 (*) [16])(auStack_1050 + lVar47));
          auVar65 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1040 + lVar47),
                                   *(undefined1 (*) [16])(auStack_1030 + lVar47));
          auVar70 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1020 + lVar47),
                                   *(undefined1 (*) [16])(auStack_1010 + lVar47));
          auVar72 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1000 + lVar47),
                                   *(undefined1 (*) [16])(auStack_ff0 + lVar47));
          auVar66 = vpunpcklwd_avx(auVar112,auVar65);
          auVar113 = vpunpcklwd_avx(auVar70,auVar72);
          auVar64 = vpunpckldq_avx(auVar66,auVar113);
          auVar66 = vpunpckhdq_avx(auVar66,auVar113);
          auVar61 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_fe0 + lVar47),
                                   *(undefined1 (*) [16])(auStack_fd0 + lVar47));
          auVar67 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_fc0 + lVar47),
                                   *(undefined1 (*) [16])(auStack_fb0 + lVar47));
          auVar63 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_fa0 + lVar47),
                                   *(undefined1 (*) [16])(auStack_f90 + lVar47));
          auVar69 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_f80 + lVar47),
                                   *(undefined1 (*) [16])(auStack_f70 + lVar47));
          auVar113 = vpunpcklwd_avx(auVar61,auVar67);
          auVar68 = vpunpcklwd_avx(auVar63,auVar69);
          auVar71 = vpunpckldq_avx(auVar113,auVar68);
          auVar113 = vpunpckhdq_avx(auVar113,auVar68);
          local_1460._0_16_ = vpunpcklqdq_avx(auVar64,auVar71);
          unique0x00102d80 = vpunpckhqdq_avx(auVar64,auVar71);
          local_1440._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
          local_1440._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
          auVar66 = vpunpckhwd_avx(auVar112,auVar65);
          auVar113 = vpunpckhwd_avx(auVar70,auVar72);
          auVar112 = vpunpckhwd_avx(auVar61,auVar67);
          auVar65 = vpunpckhwd_avx(auVar63,auVar69);
          auVar70 = vpunpckldq_avx(auVar66,auVar113);
          auVar66 = vpunpckhdq_avx(auVar66,auVar113);
          auVar72 = vpunpckldq_avx(auVar112,auVar65);
          auVar113 = vpunpckhdq_avx(auVar112,auVar65);
          local_1420._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
          local_1420._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
          local_1400._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
          local_1400._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
          auVar66 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1060 + lVar47),
                                   *(undefined1 (*) [16])(auStack_1050 + lVar47));
          auVar113 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1040 + lVar47),
                                    *(undefined1 (*) [16])(auStack_1030 + lVar47));
          auVar112 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1020 + lVar47),
                                    *(undefined1 (*) [16])(auStack_1010 + lVar47));
          auVar65 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1000 + lVar47),
                                   *(undefined1 (*) [16])(auStack_ff0 + lVar47));
          auVar70 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_fe0 + lVar47),
                                   *(undefined1 (*) [16])(auStack_fd0 + lVar47));
          auVar72 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_fc0 + lVar47),
                                   *(undefined1 (*) [16])(auStack_fb0 + lVar47));
          auVar61 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_fa0 + lVar47),
                                   *(undefined1 (*) [16])(auStack_f90 + lVar47));
          auVar67 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_f80 + lVar47),
                                   *(undefined1 (*) [16])(auStack_f70 + lVar47));
          auVar63 = vpunpcklwd_avx(auVar66,auVar113);
          auVar69 = vpunpcklwd_avx(auVar112,auVar65);
          auVar68 = vpunpcklwd_avx(auVar70,auVar72);
          auVar64 = vpunpcklwd_avx(auVar61,auVar67);
          auVar71 = vpunpckldq_avx(auVar63,auVar69);
          auVar63 = vpunpckhdq_avx(auVar63,auVar69);
          auVar73 = vpunpckldq_avx(auVar68,auVar64);
          auVar69 = vpunpckhdq_avx(auVar68,auVar64);
          local_13e0._0_16_ = vpunpcklqdq_avx(auVar71,auVar73);
          local_13e0._16_16_ = vpunpckhqdq_avx(auVar71,auVar73);
          local_13c0._0_16_ = vpunpcklqdq_avx(auVar63,auVar69);
          local_13c0._16_16_ = vpunpckhqdq_avx(auVar63,auVar69);
          auVar66 = vpunpckhwd_avx(auVar66,auVar113);
          auVar113 = vpunpckhwd_avx(auVar112,auVar65);
          auVar112 = vpunpckhwd_avx(auVar70,auVar72);
          auVar65 = vpunpckhwd_avx(auVar61,auVar67);
          auVar70 = vpunpckldq_avx(auVar66,auVar113);
          auVar66 = vpunpckhdq_avx(auVar66,auVar113);
          auVar72 = vpunpckldq_avx(auVar112,auVar65);
          auVar113 = vpunpckhdq_avx(auVar112,auVar65);
          local_13a0._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
          local_13a0._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
          local_1380._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
          local_1380._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
          lVar47 = 0;
          puVar48 = dst;
          do {
            uVar2 = *(undefined8 *)(local_1460 + lVar47 + 8);
            *(undefined8 *)puVar48 = *(undefined8 *)(local_1460 + lVar47);
            *(undefined8 *)(puVar48 + 8) = uVar2;
            lVar47 = lVar47 + 0x10;
            puVar48 = puVar48 + stride;
          } while (lVar47 != 0x100);
          dst = dst + 0x10;
          bVar60 = uVar59 < 0x30;
          uVar59 = uVar59 + 0x10;
        } while (bVar60);
        return;
      }
      if (bh == 8) {
        iVar55 = 0x27 << (bVar49 & 0x1f);
        uVar1 = left[iVar55];
        auVar68[1] = uVar1;
        auVar68[0] = uVar1;
        auVar68[2] = uVar1;
        auVar68[3] = uVar1;
        auVar68[4] = uVar1;
        auVar68[5] = uVar1;
        auVar68[6] = uVar1;
        auVar68[7] = uVar1;
        auVar68[8] = uVar1;
        auVar68[9] = uVar1;
        auVar68[10] = uVar1;
        auVar68[0xb] = uVar1;
        auVar68[0xc] = uVar1;
        auVar68[0xd] = uVar1;
        auVar68[0xe] = uVar1;
        auVar68[0xf] = uVar1;
        lVar47 = 0;
        auVar86._8_2_ = 0x10;
        auVar86._0_8_ = 0x10001000100010;
        auVar86._10_2_ = 0x10;
        auVar86._12_2_ = 0x10;
        auVar86._14_2_ = 0x10;
        auVar86._16_2_ = 0x10;
        auVar86._18_2_ = 0x10;
        auVar86._20_2_ = 0x10;
        auVar86._22_2_ = 0x10;
        auVar86._24_2_ = 0x10;
        auVar86._26_2_ = 0x10;
        auVar86._28_2_ = 0x10;
        auVar86._30_2_ = 0x10;
        auVar106._8_2_ = 0x1f;
        auVar106._0_8_ = 0x1f001f001f001f;
        auVar106._10_2_ = 0x1f;
        auVar106._12_2_ = 0x1f;
        auVar106._14_2_ = 0x1f;
        auVar106._16_2_ = 0x1f;
        auVar106._18_2_ = 0x1f;
        auVar106._20_2_ = 0x1f;
        auVar106._22_2_ = 0x1f;
        auVar106._24_2_ = 0x1f;
        auVar106._26_2_ = 0x1f;
        auVar106._28_2_ = 0x1f;
        auVar106._30_2_ = 0x1f;
        uVar59 = 0;
        uVar53 = dy;
        do {
          iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
          uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
          if ((int)uVar57 < 1) {
            if (uVar59 < 0x20) {
              do {
                *(undefined1 (*) [16])(local_1060 + lVar47) = auVar68;
                lVar47 = lVar47 + 0x10;
              } while (lVar47 != 0x200);
            }
            break;
          }
          if (7 < uVar57) {
            uVar57 = 8;
          }
          auVar66 = *(undefined1 (*) [16])(left + iVar54);
          if (upsample_left == 0) {
            auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
            uVar3 = (ushort)(uVar53 >> 1);
            uVar92 = uVar3 & 0x1f;
            auVar128._0_8_ =
                 CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
            auVar128._8_2_ = uVar92;
            auVar128._10_2_ = uVar92;
            auVar128._12_2_ = uVar92;
            auVar128._14_2_ = uVar92;
            auVar128._16_2_ = uVar92;
            auVar128._18_2_ = uVar92;
            auVar128._20_2_ = uVar92;
            auVar128._22_2_ = uVar92;
            auVar128._24_2_ = uVar92;
            auVar128._26_2_ = uVar92;
            auVar128._28_2_ = uVar92;
            auVar128._30_2_ = uVar92;
          }
          else {
            auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
            auVar113 = vpsrldq_avx(auVar66,8);
            auVar127._0_2_ = (undefined2)uVar53;
            auVar127._2_2_ = auVar127._0_2_;
            auVar127._4_2_ = auVar127._0_2_;
            auVar127._6_2_ = auVar127._0_2_;
            auVar127._8_2_ = auVar127._0_2_;
            auVar127._10_2_ = auVar127._0_2_;
            auVar127._12_2_ = auVar127._0_2_;
            auVar127._14_2_ = auVar127._0_2_;
            auVar127._16_2_ = auVar127._0_2_;
            auVar127._18_2_ = auVar127._0_2_;
            auVar127._20_2_ = auVar127._0_2_;
            auVar127._22_2_ = auVar127._0_2_;
            auVar127._24_2_ = auVar127._0_2_;
            auVar127._26_2_ = auVar127._0_2_;
            auVar127._28_2_ = auVar127._0_2_;
            auVar127._30_2_ = auVar127._0_2_;
            auVar96 = vpsllw_avx2(auVar127,ZEXT416((uint)upsample_left));
            auVar96 = vpsrlw_avx2(auVar96,1);
            auVar128 = vpand_avx2(auVar96,auVar106);
          }
          auVar96 = vpmovzxbw_avx2(auVar66);
          auVar104 = vpmovzxbw_avx2(auVar113);
          auVar104 = vpsubw_avx2(auVar104,auVar96);
          auVar104 = vpmullw_avx2(auVar104,auVar128);
          auVar96 = vpsllw_avx2(auVar96,5);
          auVar96 = vpaddw_avx2(auVar96,auVar86);
          auVar96 = vpaddw_avx2(auVar104,auVar96);
          auVar96 = vpsrlw_avx2(auVar96,5);
          auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
          auVar66 = vpblendvb_avx(auVar68,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
          *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
          uVar53 = uVar53 + dy;
          uVar59 = uVar59 + 1;
          lVar47 = lVar47 + 0x10;
        } while (uVar59 != 0x20);
        auVar112 = vpunpcklbw_avx(local_1060,auStack_1050);
        auVar65 = vpunpcklbw_avx(local_1040,auStack_1030);
        auVar70 = vpunpcklbw_avx(local_1020,auStack_1010);
        auVar72 = vpunpcklbw_avx(local_1000,auStack_ff0);
        auVar61 = vpunpcklbw_avx(local_fe0,auStack_fd0);
        auVar67 = vpunpcklbw_avx(local_fc0,auStack_fb0);
        auVar63 = vpunpcklbw_avx(local_fa0,auStack_f90);
        auVar69 = vpunpcklbw_avx(local_f80,auStack_f70);
        auVar66 = vpunpcklwd_avx(auVar112,auVar65);
        auVar113 = vpunpcklwd_avx(auVar70,auVar72);
        auVar68 = vpunpcklwd_avx(auVar61,auVar67);
        auVar64 = vpunpcklwd_avx(auVar63,auVar69);
        auVar71 = vpunpckldq_avx(auVar66,auVar113);
        auVar66 = vpunpckhdq_avx(auVar66,auVar113);
        auVar73 = vpunpckldq_avx(auVar68,auVar64);
        auVar113 = vpunpckhdq_avx(auVar68,auVar64);
        local_1460._0_16_ = vpunpcklqdq_avx(auVar71,auVar73);
        unique0x00102d80 = vpunpckhqdq_avx(auVar71,auVar73);
        local_1440._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
        local_1440._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
        auVar66 = vpunpckhwd_avx(auVar112,auVar65);
        auVar113 = vpunpckhwd_avx(auVar70,auVar72);
        auVar112 = vpunpckhwd_avx(auVar61,auVar67);
        auVar65 = vpunpckhwd_avx(auVar63,auVar69);
        auVar70 = vpunpckldq_avx(auVar66,auVar113);
        auVar66 = vpunpckhdq_avx(auVar66,auVar113);
        auVar72 = vpunpckldq_avx(auVar112,auVar65);
        auVar113 = vpunpckhdq_avx(auVar112,auVar65);
        local_1420._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
        local_1420._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
        local_1400._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
        local_1400._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
        auVar112 = vpunpcklbw_avx(local_f60,auStack_f50);
        auVar65 = vpunpcklbw_avx(local_f40,auStack_f30);
        auVar70 = vpunpcklbw_avx(local_f20,auStack_f10);
        auVar72 = vpunpcklbw_avx(local_f00,auStack_ef0);
        auVar61 = vpunpcklbw_avx(local_ee0,auStack_ed0);
        auVar67 = vpunpcklbw_avx(local_ec0,auStack_eb0);
        auVar63 = vpunpcklbw_avx(local_ea0,auStack_e90);
        auVar69 = vpunpcklbw_avx(local_e80,auStack_e70);
        auVar66 = vpunpcklwd_avx(auVar112,auVar65);
        auVar113 = vpunpcklwd_avx(auVar70,auVar72);
        auVar68 = vpunpcklwd_avx(auVar61,auVar67);
        auVar64 = vpunpcklwd_avx(auVar63,auVar69);
        auVar71 = vpunpckldq_avx(auVar66,auVar113);
        auVar66 = vpunpckhdq_avx(auVar66,auVar113);
        auVar73 = vpunpckldq_avx(auVar68,auVar64);
        auVar113 = vpunpckhdq_avx(auVar68,auVar64);
        local_13e0._0_16_ = vpunpcklqdq_avx(auVar71,auVar73);
        local_13e0._16_16_ = vpunpckhqdq_avx(auVar71,auVar73);
        local_13c0._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
        local_13c0._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
        auVar66 = vpunpckhwd_avx(auVar112,auVar65);
        auVar113 = vpunpckhwd_avx(auVar70,auVar72);
        auVar112 = vpunpckhwd_avx(auVar61,auVar67);
        auVar65 = vpunpckhwd_avx(auVar63,auVar69);
        auVar70 = vpunpckldq_avx(auVar66,auVar113);
        auVar66 = vpunpckhdq_avx(auVar66,auVar113);
        auVar72 = vpunpckldq_avx(auVar112,auVar65);
        auVar113 = vpunpckhdq_avx(auVar112,auVar65);
        local_13a0._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
        local_13a0._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
        local_1380._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
        local_1380._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
        puVar48 = dst + 0x10;
        lVar47 = 0x80;
        do {
          uVar2 = *(undefined8 *)((long)local_14e0 + lVar47 + 8);
          *(undefined8 *)(puVar48 + -0x10) = *(undefined8 *)((long)local_14e0 + lVar47);
          *(undefined8 *)(puVar48 + -8) = uVar2;
          uVar2 = *(undefined8 *)(local_1460 + lVar47 + 8);
          *(undefined8 *)puVar48 = *(undefined8 *)(local_1460 + lVar47);
          *(undefined8 *)(puVar48 + 8) = uVar2;
          lVar47 = lVar47 + 0x10;
          puVar48 = puVar48 + stride;
        } while (lVar47 != 0x100);
        return;
      }
      if (bh != 4) {
        return;
      }
      iVar55 = 0x13 << (bVar49 & 0x1f);
      uVar1 = left[iVar55];
      auVar64[1] = uVar1;
      auVar64[0] = uVar1;
      auVar64[2] = uVar1;
      auVar64[3] = uVar1;
      auVar64[4] = uVar1;
      auVar64[5] = uVar1;
      auVar64[6] = uVar1;
      auVar64[7] = uVar1;
      auVar64[8] = uVar1;
      auVar64[9] = uVar1;
      auVar64[10] = uVar1;
      auVar64[0xb] = uVar1;
      auVar64[0xc] = uVar1;
      auVar64[0xd] = uVar1;
      auVar64[0xe] = uVar1;
      auVar64[0xf] = uVar1;
      lVar47 = 0;
      auVar82._8_2_ = 0x10;
      auVar82._0_8_ = 0x10001000100010;
      auVar82._10_2_ = 0x10;
      auVar82._12_2_ = 0x10;
      auVar82._14_2_ = 0x10;
      auVar82._16_2_ = 0x10;
      auVar82._18_2_ = 0x10;
      auVar82._20_2_ = 0x10;
      auVar82._22_2_ = 0x10;
      auVar82._24_2_ = 0x10;
      auVar82._26_2_ = 0x10;
      auVar82._28_2_ = 0x10;
      auVar82._30_2_ = 0x10;
      auVar101._8_2_ = 0x1f;
      auVar101._0_8_ = 0x1f001f001f001f;
      auVar101._10_2_ = 0x1f;
      auVar101._12_2_ = 0x1f;
      auVar101._14_2_ = 0x1f;
      auVar101._16_2_ = 0x1f;
      auVar101._18_2_ = 0x1f;
      auVar101._20_2_ = 0x1f;
      auVar101._22_2_ = 0x1f;
      auVar101._24_2_ = 0x1f;
      auVar101._26_2_ = 0x1f;
      auVar101._28_2_ = 0x1f;
      auVar101._30_2_ = 0x1f;
      uVar59 = 0;
      uVar53 = dy;
      do {
        iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
        uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
        if ((int)uVar57 < 1) {
          if (uVar59 < 0x10) {
            do {
              *(undefined1 (*) [16])(local_1060 + lVar47) = auVar64;
              lVar47 = lVar47 + 0x10;
            } while (lVar47 != 0x100);
          }
          break;
        }
        if (3 < uVar57) {
          uVar57 = 4;
        }
        auVar66 = *(undefined1 (*) [16])(left + iVar54);
        if (upsample_left == 0) {
          auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
          uVar3 = (ushort)(uVar53 >> 1);
          uVar92 = uVar3 & 0x1f;
          auVar122._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
          auVar122._8_2_ = uVar92;
          auVar122._10_2_ = uVar92;
          auVar122._12_2_ = uVar92;
          auVar122._14_2_ = uVar92;
          auVar122._16_2_ = uVar92;
          auVar122._18_2_ = uVar92;
          auVar122._20_2_ = uVar92;
          auVar122._22_2_ = uVar92;
          auVar122._24_2_ = uVar92;
          auVar122._26_2_ = uVar92;
          auVar122._28_2_ = uVar92;
          auVar122._30_2_ = uVar92;
        }
        else {
          auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
          auVar113 = vpsrldq_avx(auVar66,8);
          auVar121._0_2_ = (undefined2)uVar53;
          auVar121._2_2_ = auVar121._0_2_;
          auVar121._4_2_ = auVar121._0_2_;
          auVar121._6_2_ = auVar121._0_2_;
          auVar121._8_2_ = auVar121._0_2_;
          auVar121._10_2_ = auVar121._0_2_;
          auVar121._12_2_ = auVar121._0_2_;
          auVar121._14_2_ = auVar121._0_2_;
          auVar121._16_2_ = auVar121._0_2_;
          auVar121._18_2_ = auVar121._0_2_;
          auVar121._20_2_ = auVar121._0_2_;
          auVar121._22_2_ = auVar121._0_2_;
          auVar121._24_2_ = auVar121._0_2_;
          auVar121._26_2_ = auVar121._0_2_;
          auVar121._28_2_ = auVar121._0_2_;
          auVar121._30_2_ = auVar121._0_2_;
          auVar96 = vpsllw_avx2(auVar121,ZEXT416((uint)upsample_left));
          auVar96 = vpsrlw_avx2(auVar96,1);
          auVar122 = vpand_avx2(auVar96,auVar101);
        }
        auVar96 = vpmovzxbw_avx2(auVar66);
        auVar104 = vpmovzxbw_avx2(auVar113);
        auVar104 = vpsubw_avx2(auVar104,auVar96);
        auVar104 = vpmullw_avx2(auVar104,auVar122);
        auVar96 = vpsllw_avx2(auVar96,5);
        auVar96 = vpaddw_avx2(auVar96,auVar82);
        auVar96 = vpaddw_avx2(auVar104,auVar96);
        auVar96 = vpsrlw_avx2(auVar96,5);
        auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
        auVar66 = vpblendvb_avx(auVar64,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
        *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
        uVar53 = uVar53 + dy;
        uVar59 = uVar59 + 1;
        lVar47 = lVar47 + 0x10;
      } while (uVar59 != 0x10);
      auVar112 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar65 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar70 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar72 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar61 = vpunpcklbw_avx(local_fe0,auStack_fd0);
      auVar67 = vpunpcklbw_avx(local_fc0,auStack_fb0);
      auVar63 = vpunpcklbw_avx(local_fa0,auStack_f90);
      auVar69 = vpunpcklbw_avx(local_f80,auStack_f70);
      auVar66 = vpunpcklwd_avx(auVar112,auVar65);
      auVar113 = vpunpcklwd_avx(auVar70,auVar72);
      auVar68 = vpunpcklwd_avx(auVar61,auVar67);
      auVar64 = vpunpcklwd_avx(auVar63,auVar69);
      auVar71 = vpunpckldq_avx(auVar66,auVar113);
      auVar66 = vpunpckhdq_avx(auVar66,auVar113);
      auVar73 = vpunpckldq_avx(auVar68,auVar64);
      auVar113 = vpunpckhdq_avx(auVar68,auVar64);
      local_1460._0_16_ = vpunpcklqdq_avx(auVar71,auVar73);
      unique0x00102d80 = vpunpckhqdq_avx(auVar71,auVar73);
      local_1440._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
      local_1440._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
      auVar66 = vpunpckhwd_avx(auVar112,auVar65);
      auVar113 = vpunpckhwd_avx(auVar70,auVar72);
      auVar112 = vpunpckhwd_avx(auVar61,auVar67);
      auVar65 = vpunpckhwd_avx(auVar63,auVar69);
      auVar70 = vpunpckldq_avx(auVar66,auVar113);
      auVar66 = vpunpckhdq_avx(auVar66,auVar113);
      auVar72 = vpunpckldq_avx(auVar112,auVar65);
      auVar113 = vpunpckhdq_avx(auVar112,auVar65);
      local_1420._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
      local_1420._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
      local_1400._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
      local_1400._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
      lVar47 = 0;
      do {
        uVar2 = *(undefined8 *)(local_1460 + lVar47 + 8);
        *(undefined8 *)dst = *(undefined8 *)(local_1460 + lVar47);
        *(undefined8 *)(dst + 8) = uVar2;
        lVar47 = lVar47 + 0x10;
        dst = dst + stride;
      } while (lVar47 != 0x40);
      return;
    }
    switch(bh << 0x1e | bh - 4U >> 2) {
    case 0:
      iVar55 = 0xb << (bVar49 & 0x1f);
      uVar1 = left[iVar55];
      auVar62[1] = uVar1;
      auVar62[0] = uVar1;
      auVar62[2] = uVar1;
      auVar62[3] = uVar1;
      auVar62[4] = uVar1;
      auVar62[5] = uVar1;
      auVar62[6] = uVar1;
      auVar62[7] = uVar1;
      auVar62[8] = uVar1;
      auVar62[9] = uVar1;
      auVar62[10] = uVar1;
      auVar62[0xb] = uVar1;
      auVar62[0xc] = uVar1;
      auVar62[0xd] = uVar1;
      auVar62[0xe] = uVar1;
      auVar62[0xf] = uVar1;
      lVar47 = 0;
      auVar79._8_2_ = 0x10;
      auVar79._0_8_ = 0x10001000100010;
      auVar79._10_2_ = 0x10;
      auVar79._12_2_ = 0x10;
      auVar79._14_2_ = 0x10;
      auVar79._16_2_ = 0x10;
      auVar79._18_2_ = 0x10;
      auVar79._20_2_ = 0x10;
      auVar79._22_2_ = 0x10;
      auVar79._24_2_ = 0x10;
      auVar79._26_2_ = 0x10;
      auVar79._28_2_ = 0x10;
      auVar79._30_2_ = 0x10;
      auVar98._8_2_ = 0x1f;
      auVar98._0_8_ = 0x1f001f001f001f;
      auVar98._10_2_ = 0x1f;
      auVar98._12_2_ = 0x1f;
      auVar98._14_2_ = 0x1f;
      auVar98._16_2_ = 0x1f;
      auVar98._18_2_ = 0x1f;
      auVar98._20_2_ = 0x1f;
      auVar98._22_2_ = 0x1f;
      auVar98._24_2_ = 0x1f;
      auVar98._26_2_ = 0x1f;
      auVar98._28_2_ = 0x1f;
      auVar98._30_2_ = 0x1f;
      uVar59 = 0;
      uVar53 = dy;
      do {
        iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
        uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
        if ((int)uVar57 < 1) {
          if (uVar59 < 8) {
            do {
              *(undefined1 (*) [16])(local_1060 + lVar47) = auVar62;
              lVar47 = lVar47 + 0x10;
            } while (lVar47 != 0x80);
          }
          break;
        }
        if (3 < uVar57) {
          uVar57 = 4;
        }
        auVar66 = *(undefined1 (*) [16])(left + iVar54);
        if (upsample_left == 0) {
          auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
          uVar3 = (ushort)(uVar53 >> 1);
          uVar92 = uVar3 & 0x1f;
          auVar117._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
          auVar117._8_2_ = uVar92;
          auVar117._10_2_ = uVar92;
          auVar117._12_2_ = uVar92;
          auVar117._14_2_ = uVar92;
          auVar117._16_2_ = uVar92;
          auVar117._18_2_ = uVar92;
          auVar117._20_2_ = uVar92;
          auVar117._22_2_ = uVar92;
          auVar117._24_2_ = uVar92;
          auVar117._26_2_ = uVar92;
          auVar117._28_2_ = uVar92;
          auVar117._30_2_ = uVar92;
        }
        else {
          auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
          auVar113 = vpsrldq_avx(auVar66,8);
          auVar116._0_2_ = (undefined2)uVar53;
          auVar116._2_2_ = auVar116._0_2_;
          auVar116._4_2_ = auVar116._0_2_;
          auVar116._6_2_ = auVar116._0_2_;
          auVar116._8_2_ = auVar116._0_2_;
          auVar116._10_2_ = auVar116._0_2_;
          auVar116._12_2_ = auVar116._0_2_;
          auVar116._14_2_ = auVar116._0_2_;
          auVar116._16_2_ = auVar116._0_2_;
          auVar116._18_2_ = auVar116._0_2_;
          auVar116._20_2_ = auVar116._0_2_;
          auVar116._22_2_ = auVar116._0_2_;
          auVar116._24_2_ = auVar116._0_2_;
          auVar116._26_2_ = auVar116._0_2_;
          auVar116._28_2_ = auVar116._0_2_;
          auVar116._30_2_ = auVar116._0_2_;
          auVar96 = vpsllw_avx2(auVar116,ZEXT416((uint)upsample_left));
          auVar96 = vpsrlw_avx2(auVar96,1);
          auVar117 = vpand_avx2(auVar96,auVar98);
        }
        auVar96 = vpmovzxbw_avx2(auVar66);
        auVar104 = vpmovzxbw_avx2(auVar113);
        auVar104 = vpsubw_avx2(auVar104,auVar96);
        auVar104 = vpmullw_avx2(auVar104,auVar117);
        auVar96 = vpsllw_avx2(auVar96,5);
        auVar96 = vpaddw_avx2(auVar96,auVar79);
        auVar96 = vpaddw_avx2(auVar104,auVar96);
        auVar96 = vpsrlw_avx2(auVar96,5);
        auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
        auVar66 = vpblendvb_avx(auVar62,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
        *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
        uVar53 = uVar53 + dy;
        uVar59 = uVar59 + 1;
        lVar47 = lVar47 + 0x10;
      } while (uVar59 != 8);
      auVar66 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar113 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar112 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar65 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar66 = vpunpcklwd_avx(auVar66,auVar113);
      auVar113 = vpunpcklwd_avx(auVar112,auVar65);
      auVar112 = vpunpckldq_avx(auVar66,auVar113);
      *(long *)dst = auVar112._0_8_;
      uVar2 = vpextrq_avx(auVar112,1);
      *(undefined8 *)(dst + stride) = uVar2;
      auVar66 = vpunpckhdq_avx(auVar66,auVar113);
      *(long *)(dst + stride * 2) = auVar66._0_8_;
      lVar47 = stride * 3;
      goto LAB_0035bc44;
    case 1:
      iVar55 = 0x17 << (bVar49 & 0x1f);
      uVar1 = left[iVar55];
      auVar73[1] = uVar1;
      auVar73[0] = uVar1;
      auVar73[2] = uVar1;
      auVar73[3] = uVar1;
      auVar73[4] = uVar1;
      auVar73[5] = uVar1;
      auVar73[6] = uVar1;
      auVar73[7] = uVar1;
      auVar73[8] = uVar1;
      auVar73[9] = uVar1;
      auVar73[10] = uVar1;
      auVar73[0xb] = uVar1;
      auVar73[0xc] = uVar1;
      auVar73[0xd] = uVar1;
      auVar73[0xe] = uVar1;
      auVar73[0xf] = uVar1;
      lVar47 = 0;
      auVar91._8_2_ = 0x10;
      auVar91._0_8_ = 0x10001000100010;
      auVar91._10_2_ = 0x10;
      auVar91._12_2_ = 0x10;
      auVar91._14_2_ = 0x10;
      auVar91._16_2_ = 0x10;
      auVar91._18_2_ = 0x10;
      auVar91._20_2_ = 0x10;
      auVar91._22_2_ = 0x10;
      auVar91._24_2_ = 0x10;
      auVar91._26_2_ = 0x10;
      auVar91._28_2_ = 0x10;
      auVar91._30_2_ = 0x10;
      auVar111._8_2_ = 0x1f;
      auVar111._0_8_ = 0x1f001f001f001f;
      auVar111._10_2_ = 0x1f;
      auVar111._12_2_ = 0x1f;
      auVar111._14_2_ = 0x1f;
      auVar111._16_2_ = 0x1f;
      auVar111._18_2_ = 0x1f;
      auVar111._20_2_ = 0x1f;
      auVar111._22_2_ = 0x1f;
      auVar111._24_2_ = 0x1f;
      auVar111._26_2_ = 0x1f;
      auVar111._28_2_ = 0x1f;
      auVar111._30_2_ = 0x1f;
      uVar59 = 0;
      uVar53 = dy;
      do {
        iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
        uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
        if ((int)uVar57 < 1) {
          if (uVar59 < 0x10) {
            do {
              *(undefined1 (*) [16])(local_1060 + lVar47) = auVar73;
              lVar47 = lVar47 + 0x10;
            } while (lVar47 != 0x100);
          }
          break;
        }
        if (7 < uVar57) {
          uVar57 = 8;
        }
        auVar66 = *(undefined1 (*) [16])(left + iVar54);
        if (upsample_left == 0) {
          auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
          uVar3 = (ushort)(uVar53 >> 1);
          uVar92 = uVar3 & 0x1f;
          auVar136._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
          auVar136._8_2_ = uVar92;
          auVar136._10_2_ = uVar92;
          auVar136._12_2_ = uVar92;
          auVar136._14_2_ = uVar92;
          auVar136._16_2_ = uVar92;
          auVar136._18_2_ = uVar92;
          auVar136._20_2_ = uVar92;
          auVar136._22_2_ = uVar92;
          auVar136._24_2_ = uVar92;
          auVar136._26_2_ = uVar92;
          auVar136._28_2_ = uVar92;
          auVar136._30_2_ = uVar92;
        }
        else {
          auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
          auVar113 = vpsrldq_avx(auVar66,8);
          auVar135._0_2_ = (undefined2)uVar53;
          auVar135._2_2_ = auVar135._0_2_;
          auVar135._4_2_ = auVar135._0_2_;
          auVar135._6_2_ = auVar135._0_2_;
          auVar135._8_2_ = auVar135._0_2_;
          auVar135._10_2_ = auVar135._0_2_;
          auVar135._12_2_ = auVar135._0_2_;
          auVar135._14_2_ = auVar135._0_2_;
          auVar135._16_2_ = auVar135._0_2_;
          auVar135._18_2_ = auVar135._0_2_;
          auVar135._20_2_ = auVar135._0_2_;
          auVar135._22_2_ = auVar135._0_2_;
          auVar135._24_2_ = auVar135._0_2_;
          auVar135._26_2_ = auVar135._0_2_;
          auVar135._28_2_ = auVar135._0_2_;
          auVar135._30_2_ = auVar135._0_2_;
          auVar96 = vpsllw_avx2(auVar135,ZEXT416((uint)upsample_left));
          auVar96 = vpsrlw_avx2(auVar96,1);
          auVar136 = vpand_avx2(auVar96,auVar111);
        }
        auVar96 = vpmovzxbw_avx2(auVar66);
        auVar104 = vpmovzxbw_avx2(auVar113);
        auVar104 = vpsubw_avx2(auVar104,auVar96);
        auVar104 = vpmullw_avx2(auVar104,auVar136);
        auVar96 = vpsllw_avx2(auVar96,5);
        auVar96 = vpaddw_avx2(auVar96,auVar91);
        auVar96 = vpaddw_avx2(auVar104,auVar96);
        auVar96 = vpsrlw_avx2(auVar96,5);
        auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
        auVar66 = vpblendvb_avx(auVar73,auVar66,*(undefined1 (*) [16])BaseMask[uVar57]);
        *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
        uVar53 = uVar53 + dy;
        uVar59 = uVar59 + 1;
        lVar47 = lVar47 + 0x10;
      } while (uVar59 != 0x10);
      auVar112 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar65 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar70 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar72 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar61 = vpunpcklbw_avx(local_fe0,auStack_fd0);
      auVar67 = vpunpcklbw_avx(local_fc0,auStack_fb0);
      auVar63 = vpunpcklbw_avx(local_fa0,auStack_f90);
      auVar69 = vpunpcklbw_avx(local_f80,auStack_f70);
      auVar66 = vpunpcklwd_avx(auVar112,auVar65);
      auVar113 = vpunpcklwd_avx(auVar70,auVar72);
      auVar68 = vpunpcklwd_avx(auVar61,auVar67);
      auVar64 = vpunpcklwd_avx(auVar63,auVar69);
      auVar71 = vpunpckldq_avx(auVar66,auVar113);
      auVar66 = vpunpckhdq_avx(auVar66,auVar113);
      auVar73 = vpunpckldq_avx(auVar68,auVar64);
      auVar113 = vpunpckhdq_avx(auVar68,auVar64);
      local_1460._0_16_ = vpunpcklqdq_avx(auVar71,auVar73);
      unique0x00102d80 = vpunpckhqdq_avx(auVar71,auVar73);
      local_1440._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
      local_1440._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
      auVar66 = vpunpckhwd_avx(auVar112,auVar65);
      auVar113 = vpunpckhwd_avx(auVar70,auVar72);
      auVar112 = vpunpckhwd_avx(auVar61,auVar67);
      auVar65 = vpunpckhwd_avx(auVar63,auVar69);
      auVar70 = vpunpckldq_avx(auVar66,auVar113);
      auVar66 = vpunpckhdq_avx(auVar66,auVar113);
      auVar72 = vpunpckldq_avx(auVar112,auVar65);
      auVar113 = vpunpckhdq_avx(auVar112,auVar65);
      local_1420._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
      local_1420._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
      local_1400._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
      local_1400._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
      lVar47 = 0;
      do {
        uVar2 = *(undefined8 *)(local_1460 + lVar47 + 8);
        *(undefined8 *)dst = *(undefined8 *)(local_1460 + lVar47);
        *(undefined8 *)(dst + 8) = uVar2;
        lVar47 = lVar47 + 0x10;
        dst = dst + stride;
      } while (lVar47 != 0x80);
      break;
    case 3:
      iVar55 = 0x2f << (bVar49 & 0x1f);
      uVar1 = left[iVar55];
      auVar71[1] = uVar1;
      auVar71[0] = uVar1;
      auVar71[2] = uVar1;
      auVar71[3] = uVar1;
      auVar71[4] = uVar1;
      auVar71[5] = uVar1;
      auVar71[6] = uVar1;
      auVar71[7] = uVar1;
      auVar71[8] = uVar1;
      auVar71[9] = uVar1;
      auVar71[10] = uVar1;
      auVar71[0xb] = uVar1;
      auVar71[0xc] = uVar1;
      auVar71[0xd] = uVar1;
      auVar71[0xe] = uVar1;
      auVar71[0xf] = uVar1;
      lVar47 = 0;
      auVar89._8_2_ = 0x10;
      auVar89._0_8_ = 0x10001000100010;
      auVar89._10_2_ = 0x10;
      auVar89._12_2_ = 0x10;
      auVar89._14_2_ = 0x10;
      auVar89._16_2_ = 0x10;
      auVar89._18_2_ = 0x10;
      auVar89._20_2_ = 0x10;
      auVar89._22_2_ = 0x10;
      auVar89._24_2_ = 0x10;
      auVar89._26_2_ = 0x10;
      auVar89._28_2_ = 0x10;
      auVar89._30_2_ = 0x10;
      auVar109._8_2_ = 0x1f;
      auVar109._0_8_ = 0x1f001f001f001f;
      auVar109._10_2_ = 0x1f;
      auVar109._12_2_ = 0x1f;
      auVar109._14_2_ = 0x1f;
      auVar109._16_2_ = 0x1f;
      auVar109._18_2_ = 0x1f;
      auVar109._20_2_ = 0x1f;
      auVar109._22_2_ = 0x1f;
      auVar109._24_2_ = 0x1f;
      auVar109._26_2_ = 0x1f;
      auVar109._28_2_ = 0x1f;
      auVar109._30_2_ = 0x1f;
      uVar59 = 0;
      uVar53 = dy;
      do {
        iVar54 = (int)uVar53 >> (6 - bVar49 & 0x1f);
        uVar57 = iVar55 - iVar54 >> (bVar49 & 0x1f);
        if ((int)uVar57 < 1) {
          if (uVar59 < 0x20) {
            do {
              *(undefined1 (*) [16])(local_1060 + lVar47) = auVar71;
              lVar47 = lVar47 + 0x10;
            } while (lVar47 != 0x200);
          }
          break;
        }
        uVar56 = (ulong)uVar57;
        if (0xf < uVar57) {
          uVar56 = 0x10;
        }
        auVar66 = *(undefined1 (*) [16])(left + iVar54);
        if (upsample_left == 0) {
          auVar113 = *(undefined1 (*) [16])(left + (long)iVar54 + 1);
          uVar3 = (ushort)(uVar53 >> 1);
          uVar92 = uVar3 & 0x1f;
          auVar132._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
          auVar132._8_2_ = uVar92;
          auVar132._10_2_ = uVar92;
          auVar132._12_2_ = uVar92;
          auVar132._14_2_ = uVar92;
          auVar132._16_2_ = uVar92;
          auVar132._18_2_ = uVar92;
          auVar132._20_2_ = uVar92;
          auVar132._22_2_ = uVar92;
          auVar132._24_2_ = uVar92;
          auVar132._26_2_ = uVar92;
          auVar132._28_2_ = uVar92;
          auVar132._30_2_ = uVar92;
        }
        else {
          auVar66 = vpshufb_avx(auVar66,_DAT_0050dc80);
          auVar113 = vpsrldq_avx(auVar66,8);
          auVar131._0_2_ = (undefined2)uVar53;
          auVar131._2_2_ = auVar131._0_2_;
          auVar131._4_2_ = auVar131._0_2_;
          auVar131._6_2_ = auVar131._0_2_;
          auVar131._8_2_ = auVar131._0_2_;
          auVar131._10_2_ = auVar131._0_2_;
          auVar131._12_2_ = auVar131._0_2_;
          auVar131._14_2_ = auVar131._0_2_;
          auVar131._16_2_ = auVar131._0_2_;
          auVar131._18_2_ = auVar131._0_2_;
          auVar131._20_2_ = auVar131._0_2_;
          auVar131._22_2_ = auVar131._0_2_;
          auVar131._24_2_ = auVar131._0_2_;
          auVar131._26_2_ = auVar131._0_2_;
          auVar131._28_2_ = auVar131._0_2_;
          auVar131._30_2_ = auVar131._0_2_;
          auVar96 = vpsllw_avx2(auVar131,ZEXT416((uint)upsample_left));
          auVar96 = vpsrlw_avx2(auVar96,1);
          auVar132 = vpand_avx2(auVar96,auVar109);
        }
        auVar96 = vpmovzxbw_avx2(auVar66);
        auVar104 = vpmovzxbw_avx2(auVar113);
        auVar104 = vpsubw_avx2(auVar104,auVar96);
        auVar104 = vpmullw_avx2(auVar104,auVar132);
        auVar96 = vpsllw_avx2(auVar96,5);
        auVar96 = vpaddw_avx2(auVar96,auVar89);
        auVar96 = vpaddw_avx2(auVar104,auVar96);
        auVar96 = vpsrlw_avx2(auVar96,5);
        auVar66 = vpackuswb_avx(auVar96._0_16_,auVar96._16_16_);
        auVar66 = vpblendvb_avx(auVar71,auVar66,*(undefined1 (*) [16])BaseMask[uVar56]);
        *(undefined1 (*) [16])(local_1060 + lVar47) = auVar66;
        uVar53 = uVar53 + dy;
        uVar59 = uVar59 + 1;
        lVar47 = lVar47 + 0x10;
      } while (uVar59 != 0x20);
      lVar47 = 0;
      pauVar51 = &local_1060;
      bVar60 = true;
      do {
        bVar46 = bVar60;
        auVar112 = vpunpcklbw_avx(*pauVar51,pauVar51[1]);
        auVar65 = vpunpcklbw_avx(pauVar51[2],pauVar51[3]);
        auVar70 = vpunpcklbw_avx(pauVar51[4],pauVar51[5]);
        auVar72 = vpunpcklbw_avx(pauVar51[6],pauVar51[7]);
        auVar66 = vpunpcklwd_avx(auVar112,auVar65);
        auVar113 = vpunpcklwd_avx(auVar70,auVar72);
        auVar64 = vpunpckldq_avx(auVar66,auVar113);
        auVar66 = vpunpckhdq_avx(auVar66,auVar113);
        auVar61 = vpunpcklbw_avx(pauVar51[8],pauVar51[9]);
        auVar67 = vpunpcklbw_avx(pauVar51[10],pauVar51[0xb]);
        auVar63 = vpunpcklbw_avx(pauVar51[0xc],pauVar51[0xd]);
        auVar69 = vpunpcklbw_avx(pauVar51[0xe],pauVar51[0xf]);
        auVar113 = vpunpcklwd_avx(auVar61,auVar67);
        auVar68 = vpunpcklwd_avx(auVar63,auVar69);
        auVar71 = vpunpckldq_avx(auVar113,auVar68);
        auVar113 = vpunpckhdq_avx(auVar113,auVar68);
        local_1460._0_16_ = vpunpcklqdq_avx(auVar64,auVar71);
        unique0x00102d80 = vpunpckhqdq_avx(auVar64,auVar71);
        local_1440._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
        local_1440._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
        auVar66 = vpunpckhwd_avx(auVar112,auVar65);
        auVar113 = vpunpckhwd_avx(auVar70,auVar72);
        auVar112 = vpunpckhwd_avx(auVar61,auVar67);
        auVar65 = vpunpckhwd_avx(auVar63,auVar69);
        auVar70 = vpunpckldq_avx(auVar66,auVar113);
        auVar66 = vpunpckhdq_avx(auVar66,auVar113);
        auVar72 = vpunpckldq_avx(auVar112,auVar65);
        auVar113 = vpunpckhdq_avx(auVar112,auVar65);
        local_1420._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
        local_1420._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
        local_1400._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
        local_1400._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
        auVar66 = vpunpckhbw_avx(*pauVar51,pauVar51[1]);
        auVar113 = vpunpckhbw_avx(pauVar51[2],pauVar51[3]);
        auVar112 = vpunpckhbw_avx(pauVar51[4],pauVar51[5]);
        auVar65 = vpunpckhbw_avx(pauVar51[6],pauVar51[7]);
        auVar70 = vpunpckhbw_avx(pauVar51[8],pauVar51[9]);
        auVar72 = vpunpckhbw_avx(pauVar51[10],pauVar51[0xb]);
        auVar61 = vpunpckhbw_avx(pauVar51[0xc],pauVar51[0xd]);
        auVar67 = vpunpckhbw_avx(pauVar51[0xe],pauVar51[0xf]);
        auVar63 = vpunpcklwd_avx(auVar66,auVar113);
        auVar69 = vpunpcklwd_avx(auVar112,auVar65);
        auVar68 = vpunpcklwd_avx(auVar70,auVar72);
        auVar64 = vpunpcklwd_avx(auVar61,auVar67);
        auVar71 = vpunpckldq_avx(auVar63,auVar69);
        auVar63 = vpunpckhdq_avx(auVar63,auVar69);
        auVar73 = vpunpckldq_avx(auVar68,auVar64);
        auVar69 = vpunpckhdq_avx(auVar68,auVar64);
        local_13e0._0_16_ = vpunpcklqdq_avx(auVar71,auVar73);
        local_13e0._16_16_ = vpunpckhqdq_avx(auVar71,auVar73);
        local_13c0._0_16_ = vpunpcklqdq_avx(auVar63,auVar69);
        local_13c0._16_16_ = vpunpckhqdq_avx(auVar63,auVar69);
        auVar66 = vpunpckhwd_avx(auVar66,auVar113);
        auVar113 = vpunpckhwd_avx(auVar112,auVar65);
        auVar112 = vpunpckhwd_avx(auVar70,auVar72);
        auVar65 = vpunpckhwd_avx(auVar61,auVar67);
        auVar70 = vpunpckldq_avx(auVar66,auVar113);
        auVar66 = vpunpckhdq_avx(auVar66,auVar113);
        auVar72 = vpunpckldq_avx(auVar112,auVar65);
        auVar113 = vpunpckhdq_avx(auVar112,auVar65);
        local_13a0._0_16_ = vpunpcklqdq_avx(auVar70,auVar72);
        local_13a0._16_16_ = vpunpckhqdq_avx(auVar70,auVar72);
        local_1380._0_16_ = vpunpcklqdq_avx(auVar66,auVar113);
        local_1380._16_16_ = vpunpckhqdq_avx(auVar66,auVar113);
        puVar48 = dst + lVar47;
        lVar47 = 0;
        do {
          uVar2 = *(undefined8 *)(local_1460 + lVar47 + 8);
          *(undefined8 *)puVar48 = *(undefined8 *)(local_1460 + lVar47);
          *(undefined8 *)(puVar48 + 8) = uVar2;
          lVar47 = lVar47 + 0x10;
          puVar48 = puVar48 + stride;
        } while (lVar47 != 0x100);
        lVar47 = 0x10;
        pauVar51 = &local_f60;
        bVar60 = false;
      } while (bVar46);
      break;
    case 7:
      uStack_1608 = 0x35aea2;
      dr_prediction_z1_32xN_avx2(0x40,local_1060,0x20,left,dy,iVar55);
      pitchSrc = 0x20;
      iVar55 = 0x40;
      iVar54 = 0x20;
      goto LAB_0035ae77;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z3_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_left, int dx, int dy) {
  (void)above;
  (void)dx;
  assert(dx == 1);
  assert(dy > 0);

  if (bw == bh) {
    switch (bw) {
      case 4:
        dr_prediction_z3_4x4_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 8:
        dr_prediction_z3_8x8_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 16:
        dr_prediction_z3_16x16_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 32:
        dr_prediction_z3_32x32_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 64:
        dr_prediction_z3_64x64_avx2(dst, stride, left, upsample_left, dy);
        break;
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            dr_prediction_z3_4x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x32_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_32x64_avx2(dst, stride, left, upsample_left, dy);
            break;
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_4x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x32_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x64_avx2(dst, stride, left, upsample_left, dy);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            dr_prediction_z3_8x4_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_16x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_32x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_64x32_avx2(dst, stride, left, upsample_left, dy);
            break;
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_16x4_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_32x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_64x16_avx2(dst, stride, left, upsample_left, dy);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
}